

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_secondary_kvs(void)

{
  fdb_encryption_key *pfVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  undefined8 doc;
  hbtrie **pphVar5;
  fdb_status fVar6;
  int iVar7;
  fdb_status fVar8;
  fdb_kvs_handle *pfVar9;
  size_t sVar10;
  size_t sVar11;
  fdb_file_handle **ptr_fhandle;
  size_t sVar12;
  fdb_doc *fconfig_00;
  fdb_kvs_config *config;
  fdb_config *pfVar13;
  fdb_kvs_handle *pfVar14;
  __atomic_base<unsigned_long> handle;
  __atomic_base<unsigned_long> _Var15;
  char *handle_00;
  fdb_kvs_handle *pfVar16;
  fdb_iterator *doc_00;
  fdb_kvs_handle *pfVar17;
  char *pcVar18;
  char *pcVar19;
  fdb_kvs_handle *extraout_RDX;
  ulong uVar20;
  long lVar21;
  fdb_kvs_handle **ptr_handle;
  hbtrie **seqnum;
  fdb_kvs_handle *doc_01;
  uint uVar22;
  fdb_kvs_handle *unaff_RBP;
  fdb_doc *__s;
  long lVar23;
  __atomic_base<unsigned_long> _Var24;
  undefined4 uVar25;
  fdb_file_handle *fhandle;
  fdb_iterator *pfVar26;
  fdb_kvs_handle *unaff_R12;
  char *unaff_R13;
  fdb_doc *pfVar27;
  fdb_doc **ppfVar28;
  fdb_doc *pfVar29;
  char *pcVar30;
  btree *doc_02;
  char *pcVar31;
  fdb_iterator *config_00;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *kv2;
  size_t valuelen_out;
  void *value_out;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_doc *pfStack_3180;
  fdb_iterator *pfStack_3178;
  int iStack_316c;
  fdb_kvs_handle *pfStack_3168;
  timeval tStack_3160;
  fdb_kvs_handle *pfStack_3150;
  fdb_kvs_handle *pfStack_3148;
  fdb_kvs_handle *pfStack_3140;
  fdb_kvs_handle *pfStack_3138;
  fdb_iterator *pfStack_3130;
  fdb_iterator *pfStack_3128;
  fdb_kvs_handle *pfStack_3118;
  fdb_kvs_handle *pfStack_3110;
  undefined1 auStack_3108 [24];
  fdb_kvs_handle *pfStack_30f0;
  fdb_kvs_handle *pfStack_30e8;
  fdb_kvs_handle *pfStack_30e0;
  fdb_kvs_handle *pfStack_30d8;
  undefined1 auStack_30d0 [80];
  undefined8 auStack_3080 [5];
  fdb_doc *apfStack_3058 [6];
  fdb_kvs_info fStack_3028;
  timeval tStack_2ff8;
  undefined1 auStack_2fe8 [280];
  fdb_iterator fStack_2ed0;
  fdb_kvs_handle fStack_2dd0;
  fdb_kvs_handle *pfStack_2bc8;
  fdb_kvs_handle *pfStack_2bc0;
  fdb_kvs_handle *pfStack_2bb8;
  code *pcStack_2bb0;
  fdb_kvs_handle *pfStack_2ba0;
  fdb_iterator *pfStack_2b98;
  fdb_kvs_handle *pfStack_2b90;
  fdb_kvs_handle *pfStack_2b88;
  fdb_custom_cmp_variable *pp_Stack_2b80;
  size_t sStack_2b78;
  fdb_kvs_handle *pfStack_2b70;
  fdb_kvs_info fStack_2b68;
  undefined1 auStack_2b38 [10];
  undefined1 auStack_2b2e [14];
  undefined2 uStack_2b20;
  fdb_encryption_key afStack_2a28 [7];
  fdb_kvs_handle *pfStack_2920;
  fdb_kvs_handle *pfStack_2918;
  fdb_kvs_handle *pfStack_2910;
  fdb_kvs_handle *pfStack_2908;
  fdb_kvs_handle *pfStack_2900;
  fdb_kvs_handle *pfStack_28f8;
  undefined1 auStack_28e8 [8];
  fdb_file_handle *pfStack_28e0;
  fdb_kvs_handle *pfStack_28d8;
  fdb_kvs_handle *pfStack_28d0;
  fdb_iterator *pfStack_28c8;
  undefined1 auStack_28c0 [48];
  undefined1 auStack_2890 [64];
  hbtrie *phStack_2850;
  kvs_ops_stat *pkStack_2848;
  timeval tStack_2820;
  btreeblk_handle *apbStack_2810 [33];
  undefined1 auStack_2708 [32];
  undefined2 uStack_26e8;
  undefined1 uStack_26c8;
  code *pcStack_26b0;
  undefined4 uStack_26a8;
  fdb_txn *pfStack_26a0;
  fdb_kvs_handle *pfStack_2610;
  char acStack_2608 [256];
  fdb_kvs_handle *pfStack_2508;
  fdb_kvs_handle *pfStack_2500;
  fdb_kvs_handle *pfStack_24f8;
  fdb_kvs_handle *pfStack_24f0;
  fdb_kvs_handle *pfStack_24e8;
  fdb_kvs_handle *pfStack_24e0;
  fdb_kvs_handle *pfStack_24d0;
  uint uStack_24c4;
  fdb_iterator *pfStack_24c0;
  fdb_kvs_handle *pfStack_24b8;
  undefined4 *puStack_24b0;
  fdb_kvs_handle *pfStack_24a8;
  fdb_kvs_handle *pfStack_24a0;
  fdb_iterator *pfStack_2498;
  fdb_file_handle *pfStack_2490;
  fdb_iterator *pfStack_2488;
  size_t sStack_2480;
  undefined1 auStack_2478 [32];
  timeval tStack_2458;
  undefined1 auStack_2448 [272];
  size_t sStack_2338;
  char *pcStack_2330;
  uint8_t uStack_2328;
  undefined2 uStack_2320;
  undefined1 uStack_2300;
  fdb_kvs_handle *pfStack_2248;
  char acStack_2240 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_2140;
  fdb_kvs_handle *pfStack_2138;
  fdb_kvs_handle *pfStack_2130;
  fdb_kvs_handle *pfStack_2128;
  fdb_kvs_handle *pfStack_2120;
  fdb_kvs_handle *pfStack_2118;
  fdb_kvs_handle *pfStack_2108;
  fdb_file_handle *pfStack_2100;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20f8;
  fdb_doc *pfStack_20f0;
  fdb_kvs_handle *pfStack_20e8;
  fdb_kvs_handle *pfStack_20e0;
  fdb_kvs_handle *pfStack_20d8;
  fdb_kvs_handle *pfStack_20d0;
  fdb_kvs_handle *pfStack_20c8;
  fdb_kvs_handle *pfStack_20c0;
  fdb_kvs_config fStack_20b8;
  fdb_kvs_config fStack_20a0;
  fdb_kvs_config fStack_2080;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_2060 [4];
  timeval tStack_2040;
  fdb_config fStack_2030;
  fdb_kvs_info *pfStack_1f18;
  atomic<unsigned_long> aStack_1f10;
  fdb_kvs_handle *pfStack_1f08;
  atomic<unsigned_long> aStack_1f00;
  fdb_kvs_handle *pfStack_1ef8;
  atomic<unsigned_long> aStack_1ef0;
  fdb_kvs_handle *pfStack_1ee0;
  fdb_kvs_handle *pfStack_1ed8;
  fdb_file_handle *pfStack_1ed0;
  undefined1 auStack_1ec8 [16];
  fdb_config *pfStack_1eb8;
  fdb_kvs_info fStack_1eb0;
  fdb_kvs_config fStack_1e80;
  undefined1 auStack_1e68 [176];
  char acStack_1db8 [256];
  undefined1 auStack_1cb8 [512];
  fdb_config fStack_1ab8;
  fdb_kvs_handle *pfStack_19c0;
  fdb_kvs_handle *pfStack_19b8;
  fdb_kvs_handle *pfStack_19b0;
  fdb_kvs_handle *pfStack_19a8;
  fdb_kvs_handle *pfStack_19a0;
  fdb_kvs_handle *pfStack_1998;
  fdb_kvs_handle *pfStack_1990;
  fdb_kvs_handle *pfStack_1988;
  fdb_kvs_handle *pfStack_1980;
  fdb_kvs_handle *pfStack_1978;
  fdb_file_handle *pfStack_1970;
  undefined4 *puStack_1968;
  undefined1 auStack_1960 [48];
  fdb_kvs_handle *pfStack_1930;
  undefined1 auStack_1928 [40];
  undefined1 auStack_1900 [272];
  size_t sStack_17f0;
  uint8_t uStack_17e0;
  undefined1 uStack_17d8;
  undefined1 uStack_17b8;
  fdb_kvs_handle *pfStack_1700;
  char acStack_16f8 [256];
  hbtrie **pphStack_15f8;
  fdb_kvs_handle *pfStack_15f0;
  fdb_kvs_handle *pfStack_15e8;
  fdb_config *pfStack_15e0;
  fdb_kvs_handle *pfStack_15d8;
  fdb_kvs_handle *pfStack_15d0;
  fdb_kvs_handle *pfStack_15b8;
  hbtrie *phStack_15b0;
  undefined1 auStack_15a8 [16];
  hbtrie **pphStack_1598;
  kvs_info *apkStack_1590 [3];
  hbtrie *phStack_1578;
  timeval tStack_1570;
  undefined1 auStack_1560 [184];
  char acStack_14a8 [256];
  undefined1 auStack_13a8 [520];
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined4 uStack_1184;
  undefined1 uStack_1179;
  fdb_doc *pfStack_10b0;
  fdb_kvs_handle *pfStack_10a8;
  fdb_kvs_handle *pfStack_10a0;
  fdb_doc *pfStack_1098;
  fdb_kvs_config *pfStack_1090;
  fdb_doc *pfStack_1088;
  fdb_kvs_handle *pfStack_1078;
  undefined1 auStack_1070 [16];
  fdb_kvs_handle *pfStack_1060;
  undefined1 auStack_1058 [24];
  fdb_doc *pfStack_1040;
  undefined1 auStack_1018 [64];
  fdb_doc *apfStack_fd8 [4];
  fdb_doc *pfStack_fb8;
  fdb_doc *apfStack_fb0 [5];
  fdb_doc *apfStack_f88 [5];
  timeval tStack_f60;
  char acStack_f50 [256];
  fdb_doc afStack_e50 [3];
  fdb_kvs_handle fStack_d50;
  fdb_kvs_handle *pfStack_b48;
  fdb_doc *pfStack_b40;
  fdb_file_handle **ppfStack_b38;
  fdb_kvs_handle *pfStack_b30;
  undefined1 auStack_b20 [28];
  undefined4 uStack_b04;
  undefined1 auStack_b00 [104];
  timeval tStack_a98;
  fdb_file_info fStack_a88;
  fdb_config fStack_a40;
  char acStack_948 [256];
  fdb_kvs_handle fStack_848;
  fdb_kvs_handle **ppfStack_640;
  fdb_kvs_handle *pfStack_638;
  fdb_kvs_handle *pfStack_630;
  fdb_kvs_handle *pfStack_628;
  btree *pbStack_620;
  fdb_kvs_handle *pfStack_618;
  fdb_kvs_handle *pfStack_608;
  undefined1 auStack_600 [48];
  undefined1 auStack_5d0 [32];
  timeval tStack_5b0;
  undefined1 auStack_5a0 [300];
  undefined4 uStack_474;
  undefined1 uStack_469;
  fdb_kvs_handle fStack_3a0;
  fdb_kvs_handle *pfStack_198;
  fdb_file_handle *local_168;
  fdb_kvs_handle *local_160;
  fdb_kvs_handle *local_158;
  size_t local_150;
  kvs_info *local_148;
  timeval local_140;
  fdb_kvs_config local_130;
  fdb_config local_118;
  
  gettimeofday(&local_140,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&local_168,"./mvcc_test1",&local_118);
  pfVar9 = (fdb_kvs_handle *)&local_160;
  fdb_kvs_open_default(local_168,(fdb_kvs_handle **)pfVar9,&local_130);
  fdb_kvs_open_default(local_168,&local_158,&local_130);
  pcVar18 = "val-a";
  fVar6 = fdb_set_kv(local_160,"a",1,"val-a",5);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcVar18 = "val-b";
    fVar6 = fdb_set_kv(local_160,"b",1,"val-b",5);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0010fc9a;
    fdb_commit(local_168,'\x01');
    pcVar18 = "val-v";
    fVar6 = fdb_set_kv(local_160,"b",1,"val-v",5);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0010fc9f;
    fdb_commit(local_168,'\x01');
    fVar6 = fdb_del_kv(local_160,"a",1);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0010fca4;
    fdb_commit(local_168,'\x01');
    pfVar9 = (fdb_kvs_handle *)&local_148;
    pcVar18 = (char *)pfVar9;
    fVar6 = fdb_get_kv(local_158,"b",1,(void **)pfVar9,&local_150);
    unaff_RBP = (fdb_kvs_handle *)(ulong)(uint)fVar6;
    free(local_148);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0010fca9;
    fVar6 = fdb_rollback(&local_158,3);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      fdb_close(local_168);
      fdb_shutdown();
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (rollback_secondary_kvs()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar18,"rollback secondary kv");
      return;
    }
  }
  else {
    rollback_secondary_kvs();
LAB_0010fc9a:
    rollback_secondary_kvs();
LAB_0010fc9f:
    rollback_secondary_kvs();
LAB_0010fca4:
    rollback_secondary_kvs();
LAB_0010fca9:
    rollback_secondary_kvs();
  }
  rollback_secondary_kvs();
  pfStack_618 = (fdb_kvs_handle *)0x10fcd0;
  pfStack_198 = pfVar9;
  gettimeofday(&tStack_5b0,(__timezone_ptr_t)0x0);
  pfStack_618 = (fdb_kvs_handle *)0x10fcd5;
  memleak_start();
  pfStack_618 = (fdb_kvs_handle *)0x10fce1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_618 = (fdb_kvs_handle *)0x10fcf1;
  fdb_get_default_config();
  pfVar9 = (fdb_kvs_handle *)(auStack_5d0 + 8);
  pfStack_618 = (fdb_kvs_handle *)0x10fcfe;
  fdb_get_default_kvs_config();
  auStack_5a0._272_8_ = 0x100000;
  auStack_5a0._280_8_ = (char *)0x400;
  uStack_474._0_1_ = true;
  uStack_474._1_3_ = 0;
  uStack_469 = 0;
  doc_02 = (btree *)(auStack_600 + 0x28);
  pfStack_618 = (fdb_kvs_handle *)0x10fd30;
  fdb_open((fdb_file_handle **)doc_02,"./mvcc_test1",(fdb_config *)(auStack_5a0 + 0x108));
  ptr_handle = (fdb_kvs_handle **)(auStack_600 + 0x20);
  pfStack_618 = (fdb_kvs_handle *)0x10fd43;
  fdb_kvs_open_default((fdb_file_handle *)auStack_600._40_8_,ptr_handle,(fdb_kvs_config *)pfVar9);
  pfStack_618 = (fdb_kvs_handle *)0x10fd59;
  pfVar14 = (fdb_kvs_handle *)auStack_600._32_8_;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_600._32_8_,logCallbackFunc,"multi_version_test");
  uVar25 = SUB84(pfVar14,0);
  if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011022d;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  uVar20 = 0;
  do {
    pfVar1 = &fStack_3a0.config.encryption_key;
    pfStack_618 = (fdb_kvs_handle *)0x10fd81;
    sprintf((char *)pfVar1,"key%d",uVar20 & 0xffffffff);
    pfStack_618 = (fdb_kvs_handle *)0x10fd99;
    sprintf(auStack_5a0 + 0x200,"meta%d",uVar20 & 0xffffffff);
    pfStack_618 = (fdb_kvs_handle *)0x10fdae;
    sprintf(auStack_5a0,"body%d",uVar20 & 0xffffffff);
    doc_02 = (btree *)(auStack_600 + (long)unaff_R12);
    pfStack_618 = (fdb_kvs_handle *)0x10fdbe;
    unaff_R13 = (char *)strlen((char *)pfVar1);
    unaff_RBP = (fdb_kvs_handle *)(auStack_5a0 + 0x200);
    pfStack_618 = (fdb_kvs_handle *)0x10fdd1;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
    pfStack_618 = (fdb_kvs_handle *)0x10fdde;
    sVar10 = strlen(auStack_5a0);
    pfStack_618 = (fdb_kvs_handle *)0x10fe00;
    pcVar18 = (char *)unaff_RBP;
    fdb_doc_create((fdb_doc **)doc_02,&fStack_3a0.config.encryption_key,(size_t)unaff_R13,unaff_RBP,
                   (size_t)pfVar9,auStack_5a0,sVar10);
    pfStack_618 = (fdb_kvs_handle *)0x10fe0f;
    fdb_set((fdb_kvs_handle *)auStack_600._32_8_,*(fdb_doc **)(auStack_600 + uVar20 * 8));
    uVar20 = uVar20 + 1;
    unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
  } while (uVar20 == 1);
  pfStack_618 = (fdb_kvs_handle *)0x10fe2f;
  fdb_commit((fdb_file_handle *)auStack_600._40_8_,'\x01');
  pfStack_618 = (fdb_kvs_handle *)0x10fe4b;
  fdb_open((fdb_file_handle **)auStack_5d0,"./mvcc_test1",(fdb_config *)(auStack_5a0 + 0x108));
  ptr_handle = (fdb_kvs_handle **)(auStack_600 + 0x18);
  pfStack_618 = (fdb_kvs_handle *)0x10fe60;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_5d0._0_8_,ptr_handle,(fdb_kvs_config *)(auStack_5d0 + 8));
  pfStack_618 = (fdb_kvs_handle *)0x10fe76;
  pfVar14 = (fdb_kvs_handle *)auStack_600._24_8_;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_600._24_8_,logCallbackFunc,"multi_version_test");
  uVar25 = SUB84(pfVar14,0);
  if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00110232;
  pfVar9 = (fdb_kvs_handle *)(auStack_5a0 + 0x200);
  unaff_R12 = (fdb_kvs_handle *)auStack_5a0;
  doc_02 = (btree *)0x0;
  uVar20 = 0;
  do {
    pfStack_618 = (fdb_kvs_handle *)0x10fea5;
    sprintf((char *)pfVar9,"meta2%d",uVar20 & 0xffffffff);
    pfStack_618 = (fdb_kvs_handle *)0x10feb9;
    sprintf((char *)unaff_R12,"body2%d",uVar20 & 0xffffffff);
    unaff_RBP = (fdb_kvs_handle *)(auStack_600 + (long)doc_02);
    pfStack_618 = (fdb_kvs_handle *)0x10fec9;
    sVar10 = strlen((char *)pfVar9);
    pfStack_618 = (fdb_kvs_handle *)0x10fed4;
    sVar11 = strlen((char *)unaff_R12);
    pfStack_618 = (fdb_kvs_handle *)0x10fee8;
    fdb_doc_update((fdb_doc **)unaff_RBP,pfVar9,sVar10,unaff_R12,sVar11);
    pfStack_618 = (fdb_kvs_handle *)0x10fef7;
    fdb_set((fdb_kvs_handle *)auStack_600._32_8_,*(fdb_doc **)(auStack_600 + uVar20 * 8));
    uVar20 = uVar20 + 1;
    doc_02 = (btree *)((long)doc_02 + 8);
  } while (uVar20 == 1);
  pfStack_618 = (fdb_kvs_handle *)0x10ff13;
  fdb_commit((fdb_file_handle *)auStack_600._40_8_,'\x01');
  unaff_R13 = (char *)0x0;
  do {
    pcVar18 = (char *)0x0;
    pfStack_618 = (fdb_kvs_handle *)0x10ff3f;
    fdb_doc_create((fdb_doc **)&pfStack_608,
                   (void *)(*(size_t **)(auStack_600 + (long)unaff_R13 * 8))[4],
                   **(size_t **)(auStack_600 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
    pfStack_618 = (fdb_kvs_handle *)0x10ff4e;
    fVar6 = fdb_get((fdb_kvs_handle *)auStack_600._32_8_,(fdb_doc *)pfStack_608);
    pfVar14 = pfStack_608;
    if (fVar6 != FDB_RESULT_SUCCESS) {
      pfStack_618 = (fdb_kvs_handle *)0x1101e1;
      multi_version_test();
LAB_001101e1:
      pfStack_618 = (fdb_kvs_handle *)0x1101ec;
      multi_version_test();
LAB_001101ec:
      pfStack_618 = (fdb_kvs_handle *)0x1101f7;
      multi_version_test();
      goto LAB_001101f7;
    }
    doc_02 = pfStack_608->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(auStack_600 + (long)unaff_R13 * 8);
    unaff_R12 = (fdb_kvs_handle *)unaff_RBP->staletree;
    pfStack_618 = (fdb_kvs_handle *)0x10ff77;
    iVar7 = bcmp(doc_02,unaff_R12,(size_t)(pfStack_608->kvs_config).custom_cmp);
    pfVar9 = pfVar14;
    if (iVar7 != 0) goto LAB_001101e1;
    doc_02 = (pfVar14->field_6).seqtree;
    unaff_R12 = (fdb_kvs_handle *)(unaff_RBP->field_6).seqtree;
    pfStack_618 = (fdb_kvs_handle *)0x10ff96;
    iVar7 = bcmp(doc_02,unaff_R12,(size_t)(pfVar14->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_001101ec;
    pfStack_618 = (fdb_kvs_handle *)0x10ffa6;
    fdb_doc_free((fdb_doc *)pfVar14);
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
  } while (unaff_R13 == (undefined1 *)0x1);
  unaff_R13 = (char *)0x0;
  do {
    pcVar18 = (char *)0x0;
    pfStack_618 = (fdb_kvs_handle *)0x10ffdf;
    fdb_doc_create((fdb_doc **)&pfStack_608,
                   (void *)(*(size_t **)(auStack_600 + (long)unaff_R13 * 8))[4],
                   **(size_t **)(auStack_600 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
    pfStack_618 = (fdb_kvs_handle *)0x10ffee;
    fVar6 = fdb_get((fdb_kvs_handle *)auStack_600._24_8_,(fdb_doc *)pfStack_608);
    pfVar16 = pfStack_608;
    pfVar9 = pfVar14;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001101f7;
    doc_02 = pfStack_608->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(auStack_600 + (long)unaff_R13 * 8);
    unaff_R12 = (fdb_kvs_handle *)unaff_RBP->staletree;
    pfStack_618 = (fdb_kvs_handle *)0x110017;
    iVar7 = bcmp(doc_02,unaff_R12,(size_t)(pfStack_608->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_001101fc;
    doc_02 = (pfVar16->field_6).seqtree;
    unaff_R12 = (fdb_kvs_handle *)(unaff_RBP->field_6).seqtree;
    pfStack_618 = (fdb_kvs_handle *)0x110036;
    iVar7 = bcmp(doc_02,unaff_R12,(size_t)(pfVar16->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_00110207;
    pfStack_618 = (fdb_kvs_handle *)0x110046;
    fdb_doc_free((fdb_doc *)pfVar16);
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    pfVar14 = pfVar16;
  } while (unaff_R13 == (undefined1 *)0x1);
  ptr_handle = (fdb_kvs_handle **)(auStack_600 + 0x18);
  pfStack_618 = (fdb_kvs_handle *)0x110060;
  fdb_kvs_close((fdb_kvs_handle *)auStack_600._24_8_);
  pfVar9 = (fdb_kvs_handle *)auStack_5d0;
  pfStack_618 = (fdb_kvs_handle *)0x11006d;
  fdb_close((fdb_file_handle *)auStack_5d0._0_8_);
  pfStack_618 = (fdb_kvs_handle *)0x110084;
  fdb_open((fdb_file_handle **)pfVar9,"./mvcc_test1",(fdb_config *)(auStack_5a0 + 0x108));
  pfStack_618 = (fdb_kvs_handle *)0x110094;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_5d0._0_8_,ptr_handle,(fdb_kvs_config *)(auStack_5d0 + 8));
  pfStack_618 = (fdb_kvs_handle *)0x1100aa;
  pfVar14 = (fdb_kvs_handle *)auStack_600._24_8_;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_600._24_8_,logCallbackFunc,"multi_version_test");
  uVar25 = SUB84(pfVar14,0);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    unaff_R13 = (char *)0x0;
    pfVar16 = pfVar9;
    while( true ) {
      pcVar18 = (char *)0x0;
      pfStack_618 = (fdb_kvs_handle *)0x1100de;
      fdb_doc_create((fdb_doc **)&pfStack_608,
                     (void *)(*(size_t **)(auStack_600 + (long)unaff_R13 * 8))[4],
                     **(size_t **)(auStack_600 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
      pfStack_618 = (fdb_kvs_handle *)0x1100ed;
      fVar6 = fdb_get((fdb_kvs_handle *)auStack_600._24_8_,(fdb_doc *)pfStack_608);
      pfVar9 = pfStack_608;
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      doc_02 = pfStack_608->staletree;
      unaff_RBP = *(fdb_kvs_handle **)(auStack_600 + (long)unaff_R13 * 8);
      unaff_R12 = (fdb_kvs_handle *)unaff_RBP->staletree;
      pfStack_618 = (fdb_kvs_handle *)0x110116;
      iVar7 = bcmp(doc_02,unaff_R12,(size_t)(pfStack_608->kvs_config).custom_cmp);
      if (iVar7 != 0) goto LAB_00110217;
      doc_02 = (pfVar9->field_6).seqtree;
      unaff_R12 = (fdb_kvs_handle *)(unaff_RBP->field_6).seqtree;
      pfStack_618 = (fdb_kvs_handle *)0x110135;
      iVar7 = bcmp(doc_02,unaff_R12,(size_t)(pfVar9->kvs_config).custom_cmp_param);
      if (iVar7 != 0) goto LAB_00110222;
      pfStack_618 = (fdb_kvs_handle *)0x110145;
      fdb_doc_free((fdb_doc *)pfVar9);
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      pfVar16 = pfVar9;
      if (unaff_R13 != (undefined1 *)0x1) {
        lVar21 = 0;
        do {
          pfStack_618 = (fdb_kvs_handle *)0x11015e;
          fdb_doc_free(*(fdb_doc **)(auStack_600 + lVar21 * 8));
          lVar21 = lVar21 + 1;
        } while (lVar21 == 1);
        pfStack_618 = (fdb_kvs_handle *)0x110171;
        fdb_kvs_close((fdb_kvs_handle *)auStack_600._32_8_);
        pfStack_618 = (fdb_kvs_handle *)0x11017b;
        fdb_kvs_close((fdb_kvs_handle *)auStack_600._24_8_);
        pfStack_618 = (fdb_kvs_handle *)0x110185;
        fdb_close((fdb_file_handle *)auStack_600._40_8_);
        pfStack_618 = (fdb_kvs_handle *)0x11018f;
        fdb_close((fdb_file_handle *)auStack_5d0._0_8_);
        pfStack_618 = (fdb_kvs_handle *)0x110194;
        fdb_shutdown();
        pfStack_618 = (fdb_kvs_handle *)0x110199;
        memleak_end();
        pcVar18 = "%s PASSED\n";
        if (multi_version_test()::__test_pass != '\0') {
          pcVar18 = "%s FAILED\n";
        }
        pfStack_618 = (fdb_kvs_handle *)0x1101ca;
        fprintf(_stderr,pcVar18,"multi version test");
        return;
      }
    }
    goto LAB_00110212;
  }
  goto LAB_00110237;
LAB_00111108:
  pfStack_1088 = (fdb_doc *)0x111113;
  snapshot_test();
  pfVar29 = fconfig_00;
LAB_00111113:
  fconfig_00 = pfVar29;
  pfStack_1088 = (fdb_doc *)0x111118;
  snapshot_test();
LAB_00111118:
  pfStack_1088 = (fdb_doc *)0x111123;
  snapshot_test();
LAB_00111123:
  pfVar27 = (fdb_doc *)auStack_1058;
  pfStack_1088 = (fdb_doc *)0x11112e;
  snapshot_test();
  goto LAB_0011112e;
LAB_00111a32:
  pfStack_1998 = (fdb_kvs_handle *)0x111a37;
  snapshot_with_uncomitted_data_test();
  pfVar9 = (fdb_kvs_handle *)pcVar30;
LAB_00111a37:
  pfStack_1998 = (fdb_kvs_handle *)0x111a3c;
  snapshot_with_uncomitted_data_test();
  goto LAB_00111a3c;
LAB_00112f50:
  pfStack_24e0 = (fdb_kvs_handle *)0x112f55;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f55:
  pfStack_24e0 = (fdb_kvs_handle *)0x112f5a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f5a:
  pfStack_24e0 = (fdb_kvs_handle *)0x112f6a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f6a:
  pfStack_24e0 = (fdb_kvs_handle *)0x112f75;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f75:
  pfStack_24e0 = (fdb_kvs_handle *)0x112f85;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f85:
  pfVar9 = (fdb_kvs_handle *)pcVar31;
  pfStack_24e0 = (fdb_kvs_handle *)0x112f8a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f8a:
  pfStack_24e0 = (fdb_kvs_handle *)0x112f9a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f9a:
  pfStack_24e0 = (fdb_kvs_handle *)0x112fa5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fa5:
  pfStack_24e0 = (fdb_kvs_handle *)0x112fb0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fb0:
  pfStack_24e0 = (fdb_kvs_handle *)0x112fc0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fc0:
  pfStack_24e0 = (fdb_kvs_handle *)0x112fcb;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fcb:
  pfStack_24e0 = (fdb_kvs_handle *)0x112fd0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fd0:
  pfStack_24e0 = (fdb_kvs_handle *)0x112fd5;
  in_memory_snapshot_on_dirty_hbtrie_test();
  goto LAB_00112fd5;
LAB_0011350e:
  pfStack_28f8 = (fdb_kvs_handle *)0x11351e;
  in_memory_snapshot_compaction_test();
LAB_0011351e:
  pfStack_28f8 = (fdb_kvs_handle *)0x113529;
  in_memory_snapshot_compaction_test();
LAB_00113529:
  pfStack_28f8 = (fdb_kvs_handle *)0x113539;
  in_memory_snapshot_compaction_test();
LAB_00113539:
  pfStack_28f8 = (fdb_kvs_handle *)0x113544;
  in_memory_snapshot_compaction_test();
  goto LAB_00113544;
LAB_00113a98:
  pcStack_2bb0 = (code *)0x113aa8;
  cb_inmem_snap();
LAB_00113aa8:
  pcStack_2bb0 = (code *)0x113ab8;
  cb_inmem_snap();
LAB_00113ab8:
  pcStack_2bb0 = (code *)0x113ac8;
  cb_inmem_snap();
LAB_00113ac8:
  pfVar9 = (fdb_kvs_handle *)afStack_2a28;
  pcVar19 = auStack_2b2e + 6;
  pcStack_2bb0 = (code *)0x113ad8;
  cb_inmem_snap();
  goto LAB_00113ad8;
LAB_0011456a:
  pfStack_3128 = (fdb_iterator *)0x114575;
  snapshot_clone_test();
  pfVar17 = pfVar14;
LAB_00114575:
  pfVar14 = pfVar17;
  pfStack_3128 = (fdb_iterator *)0x11457a;
  snapshot_clone_test();
LAB_0011457a:
  pfStack_3128 = (fdb_iterator *)0x114585;
  snapshot_clone_test();
LAB_00114585:
  pfVar9 = (fdb_kvs_handle *)&pfStack_3110;
  pfStack_3128 = (fdb_iterator *)0x114590;
  snapshot_clone_test();
  goto LAB_00114590;
LAB_001101f7:
  pfVar16 = pfVar9;
  pfStack_618 = (fdb_kvs_handle *)0x1101fc;
  multi_version_test();
LAB_001101fc:
  pfStack_618 = (fdb_kvs_handle *)0x110207;
  multi_version_test();
LAB_00110207:
  pfStack_618 = (fdb_kvs_handle *)0x110212;
  multi_version_test();
LAB_00110212:
  pfVar9 = pfVar16;
  pfStack_618 = (fdb_kvs_handle *)0x110217;
  multi_version_test();
LAB_00110217:
  pfStack_618 = (fdb_kvs_handle *)0x110222;
  multi_version_test();
LAB_00110222:
  ptr_handle = &pfStack_608;
  pfStack_618 = (fdb_kvs_handle *)0x11022d;
  pfVar14 = unaff_R12;
  multi_version_test();
  uVar25 = SUB84(pfVar14,0);
LAB_0011022d:
  pfStack_618 = (fdb_kvs_handle *)0x110232;
  multi_version_test();
LAB_00110232:
  pfStack_618 = (fdb_kvs_handle *)0x110237;
  multi_version_test();
LAB_00110237:
  pfStack_618 = (fdb_kvs_handle *)crash_recovery_test;
  multi_version_test();
  pfStack_b30 = (fdb_kvs_handle *)0x110260;
  uStack_b04 = uVar25;
  ppfStack_640 = ptr_handle;
  pfStack_638 = unaff_R12;
  pfStack_630 = (fdb_kvs_handle *)unaff_R13;
  pfStack_628 = pfVar9;
  pbStack_620 = doc_02;
  pfStack_618 = unaff_RBP;
  gettimeofday(&tStack_a98,(__timezone_ptr_t)0x0);
  pfStack_b30 = (fdb_kvs_handle *)0x110265;
  memleak_start();
  pfStack_b30 = (fdb_kvs_handle *)0x110271;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b30 = (fdb_kvs_handle *)0x110281;
  fdb_get_default_config();
  pfVar27 = (fdb_doc *)auStack_b00;
  pfStack_b30 = (fdb_kvs_handle *)0x11028e;
  fdb_get_default_kvs_config();
  fStack_a40.buffercache_size = 0;
  fStack_a40.seqtree_opt = '\x01';
  fStack_a40.wal_threshold = 0x400;
  fStack_a40.flags = 1;
  fStack_a40.compaction_threshold = '\0';
  ptr_fhandle = (fdb_file_handle **)(auStack_b20 + 8);
  pfStack_b30 = (fdb_kvs_handle *)0x1102c4;
  fdb_open(ptr_fhandle,"./mvcc_test2",&fStack_a40);
  pfVar9 = (fdb_kvs_handle *)auStack_b20;
  pfStack_b30 = (fdb_kvs_handle *)0x1102d7;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_b20._8_8_,(fdb_kvs_handle **)pfVar9,
             (fdb_kvs_config *)pfVar27);
  pfStack_b30 = (fdb_kvs_handle *)0x1102ed;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_b20._0_8_,logCallbackFunc,"crash_recovery_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    unaff_R13 = (char *)0x0;
    uVar20 = 0;
    do {
      pfVar1 = &fStack_848.config.encryption_key;
      pfStack_b30 = (fdb_kvs_handle *)0x110317;
      sprintf((char *)pfVar1,"key%d",uVar20 & 0xffffffff);
      pfStack_b30 = (fdb_kvs_handle *)0x110330;
      sprintf((char *)&fStack_848,"meta%d",uVar20 & 0xffffffff);
      pfStack_b30 = (fdb_kvs_handle *)0x110349;
      sprintf(acStack_948,"body%d",uVar20 & 0xffffffff);
      unaff_R12 = (fdb_kvs_handle *)(auStack_b00 + (long)unaff_R13 + 0x18);
      pfStack_b30 = (fdb_kvs_handle *)0x110359;
      unaff_RBP = (fdb_kvs_handle *)strlen((char *)pfVar1);
      pfVar9 = &fStack_848;
      pfStack_b30 = (fdb_kvs_handle *)0x11036c;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar9);
      pfStack_b30 = (fdb_kvs_handle *)0x11037c;
      sVar10 = strlen(acStack_948);
      pfStack_b30 = (fdb_kvs_handle *)0x1103a1;
      pcVar18 = (char *)pfVar9;
      fdb_doc_create((fdb_doc **)unaff_R12,&fStack_848.config.encryption_key,(size_t)unaff_RBP,
                     pfVar9,(size_t)ptr_fhandle,acStack_948,sVar10);
      pfStack_b30 = (fdb_kvs_handle *)0x1103b0;
      fdb_set((fdb_kvs_handle *)auStack_b20._0_8_,*(fdb_doc **)(auStack_b00 + uVar20 * 8 + 0x18));
      uVar20 = uVar20 + 1;
      unaff_R13 = (char *)((long)unaff_R13 + 8);
    } while (uVar20 != 10);
    pfVar27 = (fdb_doc *)0xa;
    fhandle = (fdb_file_handle *)auStack_b20._8_8_;
    if ((char)uStack_b04 != '\0') {
      pfStack_b30 = (fdb_kvs_handle *)0x1103d7;
      fVar6 = fdb_commit((fdb_file_handle *)auStack_b20._8_8_,'\x01');
      if (fVar6 != FDB_RESULT_SUCCESS) {
        pfStack_b30 = (fdb_kvs_handle *)0x1103e0;
        crash_recovery_test();
        goto LAB_001103e0;
      }
LAB_001103ef:
      pfStack_b30 = (fdb_kvs_handle *)0x110401;
      fVar6 = fdb_get_file_info((fdb_file_handle *)auStack_b20._8_8_,&fStack_a88);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00110675;
      uVar20 = (ulong)fStack_a40.blocksize;
      pfStack_b30 = (fdb_kvs_handle *)0x11042a;
      fdb_kvs_close((fdb_kvs_handle *)auStack_b20._0_8_);
      pfStack_b30 = (fdb_kvs_handle *)0x110434;
      fdb_close((fdb_file_handle *)auStack_b20._8_8_);
      pfStack_b30 = (fdb_kvs_handle *)0x110439;
      fdb_shutdown();
      pfVar9 = (fdb_kvs_handle *)((fStack_a88.file_size / uVar20) * (ulong)fStack_a40.blocksize);
      pcVar18 = (char *)(ulong)(fStack_a40.blocksize >> 2);
      pfStack_b30 = (fdb_kvs_handle *)0x11045b;
      iVar7 = _disk_dump("./mvcc_test2",(size_t)pfVar9,
                         (ulong)((fStack_a40.blocksize >> 2) + fStack_a40.blocksize * 2));
      if (iVar7 < 0) goto LAB_0011067a;
      pfStack_b30 = (fdb_kvs_handle *)0x11047c;
      fVar6 = fdb_open((fdb_file_handle **)(auStack_b20 + 8),"./mvcc_test2",&fStack_a40);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011067f;
      pfStack_b30 = (fdb_kvs_handle *)0x110498;
      fVar6 = fdb_kvs_open_default
                        ((fdb_file_handle *)auStack_b20._8_8_,(fdb_kvs_handle **)auStack_b20,
                         (fdb_kvs_config *)auStack_b00);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00110684;
      pfStack_b30 = (fdb_kvs_handle *)0x1104b8;
      fVar6 = fdb_set_log_callback
                        ((fdb_kvs_handle *)auStack_b20._0_8_,logCallbackFunc,"crash_recovery_test");
      if (fVar6 == FDB_RESULT_SUCCESS) {
        unaff_R13 = (char *)0x0;
        do {
          pcVar18 = (char *)0x0;
          pfStack_b30 = (fdb_kvs_handle *)0x1104ec;
          fdb_doc_create((fdb_doc **)(auStack_b20 + 0x10),
                         (void *)(*(size_t **)(auStack_b00 + (long)unaff_R13 * 8 + 0x18))[4],
                         **(size_t **)(auStack_b00 + (long)unaff_R13 * 8 + 0x18),(void *)0x0,0,
                         (void *)0x0,0);
          pfStack_b30 = (fdb_kvs_handle *)0x1104fb;
          fVar6 = fdb_get((fdb_kvs_handle *)auStack_b20._0_8_,(fdb_doc *)auStack_b20._16_8_);
          doc = auStack_b20._16_8_;
          if (fVar6 != FDB_RESULT_SUCCESS) {
            pfStack_b30 = (fdb_kvs_handle *)0x110655;
            crash_recovery_test();
LAB_00110655:
            pfStack_b30 = (fdb_kvs_handle *)0x110660;
            crash_recovery_test();
LAB_00110660:
            pfStack_b30 = (fdb_kvs_handle *)0x11066b;
            crash_recovery_test();
            goto LAB_0011066b;
          }
          ptr_fhandle = *(fdb_file_handle ***)(auStack_b20._16_8_ + 0x38);
          unaff_RBP = *(fdb_kvs_handle **)(auStack_b00 + (long)unaff_R13 * 8 + 0x18);
          unaff_R12 = (fdb_kvs_handle *)unaff_RBP->staletree;
          pfStack_b30 = (fdb_kvs_handle *)0x110524;
          iVar7 = bcmp(ptr_fhandle,unaff_R12,*(size_t *)(auStack_b20._16_8_ + 8));
          pfVar27 = (fdb_doc *)doc;
          if (iVar7 != 0) goto LAB_00110655;
          ptr_fhandle = *(fdb_file_handle ***)(doc + 0x40);
          unaff_R12 = (fdb_kvs_handle *)(unaff_RBP->field_6).seqtree;
          pfStack_b30 = (fdb_kvs_handle *)0x110543;
          iVar7 = bcmp(ptr_fhandle,unaff_R12,*(size_t *)(doc + 0x10));
          if (iVar7 != 0) goto LAB_00110660;
          pfStack_b30 = (fdb_kvs_handle *)0x110553;
          fdb_doc_free((fdb_doc *)doc);
          unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
        } while (unaff_R13 != (undefined1 *)0xa);
        pfVar27 = (fdb_doc *)0x1;
        while( true ) {
          pcVar18 = (char *)0x0;
          pfStack_b30 = (fdb_kvs_handle *)0x110587;
          fdb_doc_create((fdb_doc **)(auStack_b20 + 0x10),(void *)0x0,0,(void *)0x0,0,(void *)0x0,0)
          ;
          *(fdb_doc **)(auStack_b20._16_8_ + 0x28) = pfVar27;
          pfStack_b30 = (fdb_kvs_handle *)0x11059a;
          fVar6 = fdb_get_byseq((fdb_kvs_handle *)auStack_b20._0_8_,(fdb_doc *)auStack_b20._16_8_);
          if (fVar6 != FDB_RESULT_SUCCESS) break;
          pfStack_b30 = (fdb_kvs_handle *)0x1105ac;
          fdb_doc_free((fdb_doc *)auStack_b20._16_8_);
          pfVar27 = (fdb_doc *)((long)&pfVar27->keylen + 1);
          if (pfVar27 == (fdb_doc *)0xb) {
            lVar21 = 0;
            do {
              pfStack_b30 = (fdb_kvs_handle *)0x1105c1;
              fdb_doc_free(*(fdb_doc **)(auStack_b00 + lVar21 * 8 + 0x18));
              lVar21 = lVar21 + 1;
            } while (lVar21 != 10);
            pfStack_b30 = (fdb_kvs_handle *)0x1105d4;
            fdb_kvs_close((fdb_kvs_handle *)auStack_b20._0_8_);
            pfStack_b30 = (fdb_kvs_handle *)0x1105de;
            fdb_close((fdb_file_handle *)auStack_b20._8_8_);
            pfStack_b30 = (fdb_kvs_handle *)0x1105e3;
            fdb_shutdown();
            pfStack_b30 = (fdb_kvs_handle *)0x1105e8;
            memleak_end();
            if ((char)uStack_b04 == '\0') {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                pcVar18 = "%s PASSED\n";
              }
              else {
                pcVar18 = "%s FAILED\n";
              }
              pcVar19 = "crash recovery test - normal flush";
            }
            else {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                pcVar18 = "%s PASSED\n";
              }
              else {
                pcVar18 = "%s FAILED\n";
              }
              pcVar19 = "crash recovery test - walflush";
            }
            pfStack_b30 = (fdb_kvs_handle *)0x11063e;
            fprintf(_stderr,pcVar18,pcVar19);
            return;
          }
        }
LAB_0011066b:
        pfVar9 = (fdb_kvs_handle *)(auStack_b20 + 0x10);
        pfStack_b30 = (fdb_kvs_handle *)0x110670;
        crash_recovery_test();
        goto LAB_00110670;
      }
      goto LAB_00110689;
    }
LAB_001103e0:
    pfStack_b30 = (fdb_kvs_handle *)0x1103e7;
    fVar6 = fdb_commit(fhandle,'\0');
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_001103ef;
  }
  else {
LAB_00110670:
    pfStack_b30 = (fdb_kvs_handle *)0x110675;
    crash_recovery_test();
LAB_00110675:
    pfStack_b30 = (fdb_kvs_handle *)0x11067a;
    crash_recovery_test();
LAB_0011067a:
    pfStack_b30 = (fdb_kvs_handle *)0x11067f;
    crash_recovery_test();
LAB_0011067f:
    pfStack_b30 = (fdb_kvs_handle *)0x110684;
    crash_recovery_test();
LAB_00110684:
    pfStack_b30 = (fdb_kvs_handle *)0x110689;
    crash_recovery_test();
LAB_00110689:
    pfStack_b30 = (fdb_kvs_handle *)0x11068e;
    crash_recovery_test();
  }
  pfStack_b30 = (fdb_kvs_handle *)snapshot_test;
  crash_recovery_test();
  pcVar19 = (char *)0x0;
  pfStack_1088 = (fdb_doc *)0x1106b6;
  fStack_d50.bub_ctx.space_used = (uint64_t)pfVar9;
  fStack_d50.bub_ctx.handle = unaff_R12;
  pfStack_b48 = (fdb_kvs_handle *)unaff_R13;
  pfStack_b40 = pfVar27;
  ppfStack_b38 = ptr_fhandle;
  pfStack_b30 = unaff_RBP;
  gettimeofday((timeval *)(apfStack_f88 + 5),(__timezone_ptr_t)0x0);
  pfStack_1088 = (fdb_doc *)0x1106bb;
  memleak_start();
  auStack_1058._0_8_ = (fdb_doc *)0x0;
  pfStack_1088 = (fdb_doc *)0x1106cf;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = (fdb_doc *)&fStack_d50.config.encryption_key;
  pfStack_1088 = (fdb_doc *)0x1106df;
  fdb_get_default_config();
  config = (fdb_kvs_config *)auStack_1018;
  pfStack_1088 = (fdb_doc *)0x1106ec;
  fdb_get_default_kvs_config();
  fStack_d50.config.encryption_key.bytes[4] = '\0';
  fStack_d50.config.encryption_key.bytes[5] = '\0';
  fStack_d50.config.encryption_key.bytes[6] = '\0';
  fStack_d50.config.encryption_key.bytes[7] = '\0';
  fStack_d50.config.encryption_key.bytes[8] = '\0';
  fStack_d50.config.encryption_key.bytes[9] = '\0';
  fStack_d50.config.encryption_key.bytes[10] = '\0';
  fStack_d50.config.encryption_key.bytes[0xb] = '\0';
  fStack_d50.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_d50.config.encryption_key.bytes[0xc] = '\0';
  fStack_d50.config.encryption_key.bytes[0xd] = '\x04';
  fStack_d50.config.encryption_key.bytes[0xe] = '\0';
  fStack_d50.config.encryption_key.bytes[0xf] = '\0';
  fStack_d50.config.encryption_key.bytes[0x10] = '\0';
  fStack_d50.config.encryption_key.bytes[0x11] = '\0';
  fStack_d50.config.encryption_key.bytes[0x12] = '\0';
  fStack_d50.config.encryption_key.bytes[0x13] = '\0';
  fStack_d50.config._180_4_ = 1;
  fStack_d50.config.block_reusing_threshold._7_1_ = 0;
  pfStack_1088 = (fdb_doc *)0x110712;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar27 = (fdb_doc *)(auStack_1070 + 8);
  pfStack_1088 = (fdb_doc *)0x110729;
  fVar6 = fdb_open((fdb_file_handle **)pfVar27,"./mvcc_test1",(fdb_config *)fconfig_00);
  __s = (fdb_doc *)(ulong)(uint)fVar6;
  pfStack_1088 = (fdb_doc *)0x11073b;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1070._8_8_,&pfStack_1078,config);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfStack_1088 = (fdb_doc *)0x110754;
    fVar6 = fdb_snapshot_open(pfStack_1078,&pfStack_1060,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111133;
    pfStack_1088 = (fdb_doc *)0x11076b;
    fdb_get_kvs_info(pfStack_1060,(fdb_kvs_info *)(auStack_1058 + 0x10));
    if (pfStack_1040 != (fdb_doc *)0x0) {
      pfStack_1088 = (fdb_doc *)0x11077b;
      snapshot_test();
    }
    pfVar27 = (fdb_doc *)auStack_1070;
    pcVar18 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x11079e;
    fdb_iterator_init(pfStack_1060,(fdb_iterator **)pfVar27,(void *)0x0,0,(void *)0x0,0,0);
    pfStack_1088 = (fdb_doc *)0x1107ab;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1070._0_8_,(fdb_doc **)auStack_1058);
    if (fVar6 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00111138;
    pfStack_1088 = (fdb_doc *)0x1107be;
    fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    pfStack_1088 = (fdb_doc *)0x1107c8;
    fdb_kvs_close(pfStack_1060);
    lVar21 = 0;
    uVar20 = 0;
    do {
      pfStack_1088 = (fdb_doc *)0x1107e8;
      sprintf(acStack_f50,"key%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110800;
      sprintf((char *)&fStack_d50,"meta%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110818;
      sprintf((char *)afStack_e50,"body%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x11082b;
      sVar10 = strlen(acStack_f50);
      pfStack_1088 = (fdb_doc *)0x11083e;
      sVar11 = strlen((char *)&fStack_d50);
      pfStack_1088 = (fdb_doc *)0x11084e;
      sVar12 = strlen((char *)afStack_e50);
      pfStack_1088 = (fdb_doc *)0x110873;
      fdb_doc_create((fdb_doc **)(auStack_1018 + lVar21 + 0x18),acStack_f50,sVar10,&fStack_d50,
                     sVar11,afStack_e50,sVar12);
      pfStack_1088 = (fdb_doc *)0x110885;
      fdb_set(pfStack_1078,apfStack_fd8[uVar20 - 5]);
      uVar20 = uVar20 + 1;
      lVar21 = lVar21 + 8;
    } while (uVar20 != 5);
    pfStack_1088 = (fdb_doc *)0x1108a5;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\x01');
    uVar20 = 5;
    ppfVar28 = apfStack_fd8;
    do {
      pfStack_1088 = (fdb_doc *)0x1108cd;
      sprintf(acStack_f50,"key%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x1108e8;
      sprintf((char *)&fStack_d50,"meta%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110903;
      sprintf((char *)afStack_e50,"body%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x11090b;
      sVar10 = strlen(acStack_f50);
      pfStack_1088 = (fdb_doc *)0x110916;
      sVar11 = strlen((char *)&fStack_d50);
      pfStack_1088 = (fdb_doc *)0x110921;
      sVar12 = strlen((char *)afStack_e50);
      pfStack_1088 = (fdb_doc *)0x110941;
      fdb_doc_create(ppfVar28,acStack_f50,sVar10,&fStack_d50,sVar11,afStack_e50,sVar12);
      pfStack_1088 = (fdb_doc *)0x11094e;
      fdb_set(pfStack_1078,*ppfVar28);
      uVar20 = uVar20 + 1;
      ppfVar28 = ppfVar28 + 1;
    } while (uVar20 != 9);
    pfStack_1088 = (fdb_doc *)0x11097d;
    sprintf(acStack_f50,"key%d",9);
    pfStack_1088 = (fdb_doc *)0x11099b;
    sprintf((char *)&fStack_d50,"meta%d",9);
    pfStack_1088 = (fdb_doc *)0x1109b9;
    sprintf((char *)afStack_e50,"Body%d",9);
    pfStack_1088 = (fdb_doc *)0x1109c9;
    sVar10 = strlen(acStack_f50);
    pfStack_1088 = (fdb_doc *)0x1109d4;
    sVar11 = strlen((char *)&fStack_d50);
    pfStack_1088 = (fdb_doc *)0x1109df;
    sVar12 = strlen((char *)afStack_e50);
    pfStack_1088 = (fdb_doc *)0x1109fa;
    fdb_doc_create(&pfStack_fb8,acStack_f50,sVar10,&fStack_d50,sVar11,afStack_e50,sVar12);
    pfStack_1088 = (fdb_doc *)0x110a08;
    fdb_set(pfStack_1078,pfStack_fb8);
    pfStack_1088 = (fdb_doc *)0x110a14;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    *(undefined1 *)pfStack_fb8->body = 0x62;
    pfStack_1088 = (fdb_doc *)0x110a2d;
    fdb_set(pfStack_1078,pfStack_fb8);
    pfStack_1088 = (fdb_doc *)0x110a39;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    auStack_1058._8_8_ = pfStack_fb8->seqnum;
    pfStack_1088 = (fdb_doc *)0x110a50;
    fdb_set(pfStack_1078,pfStack_fb8);
    pfStack_1088 = (fdb_doc *)0x110a5c;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    uVar20 = 10;
    unaff_R13 = (char *)0x50;
    do {
      pfStack_1088 = (fdb_doc *)0x110a82;
      sprintf(acStack_f50,"key%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110a9d;
      sprintf((char *)&fStack_d50,"meta%d",uVar20 & 0xffffffff);
      __s = afStack_e50;
      pfStack_1088 = (fdb_doc *)0x110ab8;
      sprintf((char *)__s,"body%d",uVar20 & 0xffffffff);
      pcVar19 = auStack_1018 + (long)unaff_R13 + 0x18;
      pfStack_1088 = (fdb_doc *)0x110acb;
      fconfig_00 = (fdb_doc *)strlen(acStack_f50);
      pfStack_1088 = (fdb_doc *)0x110ad6;
      config = (fdb_kvs_config *)strlen((char *)&fStack_d50);
      pfStack_1088 = (fdb_doc *)0x110ae1;
      sVar10 = strlen((char *)__s);
      pcVar18 = (char *)&fStack_d50;
      pfStack_1088 = (fdb_doc *)0x110b06;
      fdb_doc_create((fdb_doc **)pcVar19,acStack_f50,(size_t)fconfig_00,pcVar18,(size_t)config,__s,
                     sVar10);
      pfStack_1088 = (fdb_doc *)0x110b18;
      fdb_set(pfStack_1078,apfStack_fd8[uVar20 - 5]);
      uVar20 = uVar20 + 1;
      unaff_R13 = (char *)((long)unaff_R13 + 8);
    } while (uVar20 != 0xf);
    pfStack_1088 = (fdb_doc *)0x110b38;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\x01');
    pfStack_1088 = (fdb_doc *)0x110b50;
    fVar6 = fdb_set_log_callback(pfStack_1078,logCallbackFunc,"snapshot_test");
    pfVar27 = (fdb_doc *)0xf;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011113d;
    pfStack_1088 = (fdb_doc *)0x110b6c;
    fVar6 = fdb_snapshot_open(pfStack_1078,&pfStack_1060,999999);
    fconfig_00 = (fdb_doc *)auStack_1058._8_8_;
    if (fVar6 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00111142;
    pfStack_1088 = (fdb_doc *)0x110b8c;
    fVar6 = fdb_snapshot_open(pfStack_1078,&pfStack_1060,auStack_1058._8_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111147;
    pfStack_1088 = (fdb_doc *)0x110ba6;
    fdb_get_kvs_info(pfStack_1060,(fdb_kvs_info *)(auStack_1058 + 0x10));
    if (pfStack_1040 != fconfig_00) {
      pfStack_1088 = (fdb_doc *)0x110bb9;
      snapshot_test();
    }
    uVar20 = 0xf;
    pfVar29 = (fdb_doc *)apfStack_f88;
    do {
      pfStack_1088 = (fdb_doc *)0x110be1;
      sprintf(acStack_f50,"key%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110bfc;
      sprintf((char *)&fStack_d50,"meta%d",uVar20 & 0xffffffff);
      __s = afStack_e50;
      pfStack_1088 = (fdb_doc *)0x110c17;
      sprintf((char *)__s,"body%d",uVar20 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110c1f;
      config = (fdb_kvs_config *)strlen(acStack_f50);
      pfStack_1088 = (fdb_doc *)0x110c2a;
      pcVar19 = (char *)strlen((char *)&fStack_d50);
      pfStack_1088 = (fdb_doc *)0x110c35;
      sVar10 = strlen((char *)__s);
      pfStack_1088 = (fdb_doc *)0x110c55;
      fdb_doc_create((fdb_doc **)pfVar29,acStack_f50,(size_t)config,&fStack_d50,(size_t)pcVar19,__s,
                     sVar10);
      pfStack_1088 = (fdb_doc *)0x110c62;
      fdb_set(pfStack_1078,*(fdb_doc **)pfVar29);
      uVar20 = uVar20 + 1;
      pfVar29 = (fdb_doc *)((long)pfVar29 + 8);
    } while (uVar20 != 0x14);
    unaff_R13 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x110c82;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    pcVar18 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x110ca2;
    fdb_iterator_init(pfStack_1060,(fdb_iterator **)auStack_1070,(void *)0x0,0,(void *)0x0,0,0);
    pfVar27 = (fdb_doc *)auStack_1058;
    do {
      pfStack_1088 = (fdb_doc *)0x110cb4;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1070._0_8_,(fdb_doc **)pfVar27);
      fconfig_00 = (fdb_doc *)auStack_1058._0_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_001110ed:
        pfStack_1088 = (fdb_doc *)0x1110f2;
        snapshot_test();
        fconfig_00 = pfVar29;
LAB_001110f2:
        pfStack_1088 = (fdb_doc *)0x1110fd;
        snapshot_test();
LAB_001110fd:
        pfStack_1088 = (fdb_doc *)0x111108;
        snapshot_test();
        goto LAB_00111108;
      }
      config = *(fdb_kvs_config **)(auStack_1058._0_8_ + 0x20);
      __s = apfStack_fd8
            [(long)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 3)];
      pcVar19 = (char *)__s->key;
      pfStack_1088 = (fdb_doc *)0x110cdf;
      iVar7 = bcmp(config,pcVar19,*(size_t *)auStack_1058._0_8_);
      pfVar29 = fconfig_00;
      if (iVar7 != 0) {
        pfStack_1088 = (fdb_doc *)0x1110ed;
        snapshot_test();
        goto LAB_001110ed;
      }
      config = *(fdb_kvs_config **)((long)fconfig_00 + 0x38);
      pcVar19 = (char *)__s->meta;
      pfStack_1088 = (fdb_doc *)0x110cfe;
      iVar7 = bcmp(config,pcVar19,*(size_t *)((long)fconfig_00 + 8));
      if (iVar7 != 0) goto LAB_001110fd;
      config = *(fdb_kvs_config **)((long)fconfig_00 + 0x40);
      pcVar19 = (char *)__s->body;
      pfStack_1088 = (fdb_doc *)0x110d1d;
      iVar7 = bcmp(config,pcVar19,*(size_t *)((long)fconfig_00 + 0x10));
      if (iVar7 != 0) goto LAB_001110f2;
      pfStack_1088 = (fdb_doc *)0x110d2d;
      fdb_doc_free(fconfig_00);
      auStack_1058._0_8_ = (fdb_doc *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      pfStack_1088 = (fdb_doc *)0x110d43;
      fVar6 = fdb_iterator_next((fdb_iterator *)auStack_1070._0_8_);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 10) goto LAB_0011114c;
    pfStack_1088 = (fdb_doc *)0x110d63;
    fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    unaff_R13 = (char *)0x0;
    pcVar18 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x110d7a;
    fdb_iterator_sequence_init(pfStack_1060,(fdb_iterator **)auStack_1070,0,0,0);
    pfVar27 = (fdb_doc *)auStack_1058;
    do {
      pfStack_1088 = (fdb_doc *)0x110d8c;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1070._0_8_,(fdb_doc **)pfVar27);
      fconfig_00 = (fdb_doc *)auStack_1058._0_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111113;
      config = *(fdb_kvs_config **)(auStack_1058._0_8_ + 0x20);
      __s = apfStack_fd8
            [(long)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 3)];
      pcVar19 = (char *)__s->key;
      pfStack_1088 = (fdb_doc *)0x110db7;
      iVar7 = bcmp(config,pcVar19,*(size_t *)auStack_1058._0_8_);
      if (iVar7 != 0) goto LAB_00111108;
      config = *(fdb_kvs_config **)((long)fconfig_00 + 0x38);
      pcVar19 = (char *)__s->meta;
      pfStack_1088 = (fdb_doc *)0x110dd6;
      iVar7 = bcmp(config,pcVar19,*(size_t *)((long)fconfig_00 + 8));
      if (iVar7 != 0) goto LAB_00111123;
      config = *(fdb_kvs_config **)((long)fconfig_00 + 0x40);
      pcVar19 = (char *)__s->body;
      pfStack_1088 = (fdb_doc *)0x110df5;
      iVar7 = bcmp(config,pcVar19,*(size_t *)((long)fconfig_00 + 0x10));
      if (iVar7 != 0) goto LAB_00111118;
      pfStack_1088 = (fdb_doc *)0x110e05;
      fdb_doc_free(fconfig_00);
      auStack_1058._0_8_ = (fdb_doc *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      pfStack_1088 = (fdb_doc *)0x110e1b;
      fVar6 = fdb_iterator_next((fdb_iterator *)auStack_1070._0_8_);
      pfVar29 = fconfig_00;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 10) goto LAB_00111151;
    pfStack_1088 = (fdb_doc *)0x110e38;
    fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    pfStack_1088 = (fdb_doc *)0x110e42;
    fdb_kvs_close(pfStack_1078);
    pfStack_1088 = (fdb_doc *)0x110e4c;
    fdb_kvs_close(pfStack_1060);
    pfStack_1088 = (fdb_doc *)0x110e56;
    fdb_close((fdb_file_handle *)auStack_1070._8_8_);
    lVar21 = 0;
    do {
      pfStack_1088 = (fdb_doc *)0x110e65;
      fdb_doc_free(apfStack_fd8[lVar21 + -5]);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x14);
    pfStack_1088 = (fdb_doc *)0x110e87;
    fVar6 = fdb_open((fdb_file_handle **)(auStack_1070 + 8),"./mvcc_test2",
                     (fdb_config *)&fStack_d50.config.encryption_key);
    pfVar27 = (fdb_doc *)0x14;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111156;
    pcVar18 = auStack_1018;
    pfStack_1088 = (fdb_doc *)0x110eaa;
    fVar6 = fdb_kvs_open((fdb_file_handle *)auStack_1070._8_8_,&pfStack_1078,"kv2",
                         (fdb_kvs_config *)pcVar18);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011115b;
    pcVar18 = "val-a";
    pfStack_1088 = (fdb_doc *)0x110ed5;
    fVar6 = fdb_set_kv(pfStack_1078,"a",1,"val-a",5);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111160;
    pfStack_1088 = (fdb_doc *)0x110ee9;
    fVar6 = fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111165;
    pcVar18 = "val-b";
    pfStack_1088 = (fdb_doc *)0x110f14;
    fVar6 = fdb_set_kv(pfStack_1078,"b",1,"val-b",5);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011116a;
    pfStack_1088 = (fdb_doc *)0x110f28;
    fVar6 = fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011116f;
    pcVar18 = "val-c";
    pfStack_1088 = (fdb_doc *)0x110f53;
    fVar6 = fdb_set_kv(pfStack_1078,"c",1,"val-c",5);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111174;
    pfStack_1088 = (fdb_doc *)0x110f67;
    fVar6 = fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111179;
    pfStack_1088 = (fdb_doc *)0x110f7e;
    fVar6 = fdb_get_kvs_info(pfStack_1078,(fdb_kvs_info *)(auStack_1058 + 0x10));
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011117e;
    pcVar18 = (char *)0x1;
    pfStack_1088 = (fdb_doc *)0x110fba;
    fVar6 = fdb_iterator_init(pfStack_1078,(fdb_iterator **)auStack_1070,"a",1,"c",1,0);
    pfVar27 = pfStack_1040;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111183;
    pcVar18 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x110fda;
    fVar6 = fdb_iterator_seek((fdb_iterator *)auStack_1070._0_8_,"b",1,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111188;
    pfStack_1088 = (fdb_doc *)0x110fec;
    fVar6 = fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011118d;
    pfStack_1088 = (fdb_doc *)0x111006;
    fVar6 = fdb_snapshot_open(pfStack_1078,&pfStack_1060,(fdb_seqnum_t)pfStack_1040);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111192;
    pcVar18 = (char *)0x1;
    pfStack_1088 = (fdb_doc *)0x11103d;
    fVar6 = fdb_iterator_init(pfStack_1060,(fdb_iterator **)auStack_1070,"a",1,"c",1,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111197;
    pcVar18 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x11105d;
    fVar6 = fdb_iterator_seek((fdb_iterator *)auStack_1070._0_8_,"b",1,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011119c;
    pfStack_1088 = (fdb_doc *)0x11106f;
    fVar6 = fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_1088 = (fdb_doc *)0x111081;
      fdb_kvs_close(pfStack_1078);
      pfStack_1088 = (fdb_doc *)0x11108b;
      fdb_kvs_close(pfStack_1060);
      pfStack_1088 = (fdb_doc *)0x111095;
      fdb_close((fdb_file_handle *)auStack_1070._8_8_);
      pfStack_1088 = (fdb_doc *)0x11109a;
      fdb_shutdown();
      pfStack_1088 = (fdb_doc *)0x11109f;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (snapshot_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_1088 = (fdb_doc *)0x1110d0;
      fprintf(_stderr,pcVar18,"snapshot test");
      return;
    }
  }
  else {
LAB_0011112e:
    pfStack_1088 = (fdb_doc *)0x111133;
    snapshot_test();
LAB_00111133:
    pfStack_1088 = (fdb_doc *)0x111138;
    snapshot_test();
LAB_00111138:
    pfStack_1088 = (fdb_doc *)0x11113d;
    snapshot_test();
LAB_0011113d:
    pfStack_1088 = (fdb_doc *)0x111142;
    snapshot_test();
LAB_00111142:
    pfStack_1088 = (fdb_doc *)0x111147;
    snapshot_test();
LAB_00111147:
    pfStack_1088 = (fdb_doc *)0x11114c;
    snapshot_test();
LAB_0011114c:
    pfStack_1088 = (fdb_doc *)0x111151;
    snapshot_test();
LAB_00111151:
    pfStack_1088 = (fdb_doc *)0x111156;
    snapshot_test();
LAB_00111156:
    pfStack_1088 = (fdb_doc *)0x11115b;
    snapshot_test();
LAB_0011115b:
    pfStack_1088 = (fdb_doc *)0x111160;
    snapshot_test();
LAB_00111160:
    pfStack_1088 = (fdb_doc *)0x111165;
    snapshot_test();
LAB_00111165:
    pfStack_1088 = (fdb_doc *)0x11116a;
    snapshot_test();
LAB_0011116a:
    pfStack_1088 = (fdb_doc *)0x11116f;
    snapshot_test();
LAB_0011116f:
    pfStack_1088 = (fdb_doc *)0x111174;
    snapshot_test();
LAB_00111174:
    pfStack_1088 = (fdb_doc *)0x111179;
    snapshot_test();
LAB_00111179:
    pfStack_1088 = (fdb_doc *)0x11117e;
    snapshot_test();
LAB_0011117e:
    pfStack_1088 = (fdb_doc *)0x111183;
    snapshot_test();
LAB_00111183:
    pfStack_1088 = (fdb_doc *)0x111188;
    snapshot_test();
LAB_00111188:
    pfStack_1088 = (fdb_doc *)0x11118d;
    snapshot_test();
LAB_0011118d:
    pfStack_1088 = (fdb_doc *)0x111192;
    snapshot_test();
LAB_00111192:
    pfStack_1088 = (fdb_doc *)0x111197;
    snapshot_test();
LAB_00111197:
    pfStack_1088 = (fdb_doc *)0x11119c;
    snapshot_test();
LAB_0011119c:
    pfStack_1088 = (fdb_doc *)0x1111a1;
    snapshot_test();
  }
  pfStack_1088 = (fdb_doc *)snapshot_stats_test;
  snapshot_test();
  pfStack_15d0 = (fdb_kvs_handle *)0x1111c3;
  pfStack_10b0 = pfVar27;
  pfStack_10a8 = (fdb_kvs_handle *)pcVar19;
  pfStack_10a0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1098 = fconfig_00;
  pfStack_1090 = config;
  pfStack_1088 = __s;
  gettimeofday(&tStack_1570,(__timezone_ptr_t)0x0);
  pfStack_15d0 = (fdb_kvs_handle *)0x1111c8;
  memleak_start();
  pfStack_15d0 = (fdb_kvs_handle *)0x1111d7;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar13 = (fdb_config *)(auStack_13a8 + 0x200);
  pfStack_15d0 = (fdb_kvs_handle *)0x1111e7;
  fdb_get_default_config();
  pcVar31 = auStack_1560;
  pfStack_15d0 = (fdb_kvs_handle *)0x1111f4;
  fdb_get_default_kvs_config();
  uStack_11a0 = 0;
  uStack_1198 = 0x400;
  uStack_1184 = 1;
  uStack_1179 = 0;
  pfStack_15d0 = (fdb_kvs_handle *)0x111219;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_15d0 = (fdb_kvs_handle *)0x111230;
  fVar6 = fdb_open((fdb_file_handle **)&phStack_15b0,"./mvcc_test1",pfVar13);
  handle._M_i = (__int_type)(uint)fVar6;
  pfStack_15d0 = (fdb_kvs_handle *)0x111242;
  fdb_kvs_open_default((fdb_file_handle *)phStack_15b0,&pfStack_15b8,(fdb_kvs_config *)pcVar31);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcVar19 = (char *)0x0;
    uVar20 = 0;
    do {
      pfStack_15d0 = (fdb_kvs_handle *)0x11126a;
      sprintf(auStack_13a8 + 0x100,"key%d",uVar20 & 0xffffffff);
      pfStack_15d0 = (fdb_kvs_handle *)0x111282;
      sprintf(auStack_13a8,"meta%d",uVar20 & 0xffffffff);
      pfStack_15d0 = (fdb_kvs_handle *)0x11129a;
      sprintf(acStack_14a8,"body%d",uVar20 & 0xffffffff);
      pcVar31 = auStack_1560 + (long)pcVar19 + 0x18;
      pfStack_15d0 = (fdb_kvs_handle *)0x1112ad;
      unaff_R13 = (char *)strlen(auStack_13a8 + 0x100);
      handle._M_i = (__int_type)auStack_13a8;
      pfStack_15d0 = (fdb_kvs_handle *)0x1112c0;
      pfVar13 = (fdb_config *)strlen((char *)handle._M_i);
      pfStack_15d0 = (fdb_kvs_handle *)0x1112d0;
      sVar10 = strlen(acStack_14a8);
      pfStack_15d0 = (fdb_kvs_handle *)0x1112f5;
      pcVar18 = (char *)handle._M_i;
      fdb_doc_create((fdb_doc **)pcVar31,auStack_13a8 + 0x100,(size_t)unaff_R13,(void *)handle._M_i,
                     (size_t)pfVar13,acStack_14a8,sVar10);
      pfStack_15d0 = (fdb_kvs_handle *)0x111307;
      fdb_set(pfStack_15b8,*(fdb_doc **)(auStack_1560 + uVar20 * 8 + 0x18));
      pfStack_15d0 = (fdb_kvs_handle *)0x111314;
      fdb_doc_free(*(fdb_doc **)(auStack_1560 + uVar20 * 8 + 0x18));
      uVar20 = uVar20 + 1;
      pcVar19 = (char *)((long)pcVar19 + 8);
    } while (uVar20 != 0x14);
    pfStack_15d0 = (fdb_kvs_handle *)0x111334;
    fdb_commit((fdb_file_handle *)phStack_15b0,'\x01');
    pfStack_15d0 = (fdb_kvs_handle *)0x111343;
    fVar6 = fdb_get_kvs_info(pfStack_15b8,(fdb_kvs_info *)(auStack_15a8 + 8));
    seqnum = pphStack_1598;
    pphVar5 = (hbtrie **)0x14;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001114c8;
    pfStack_15d0 = (fdb_kvs_handle *)0x111368;
    fVar6 = fdb_set_log_callback(pfStack_15b8,logCallbackFunc,"snapshot_stats_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001114cd;
    pfStack_15d0 = (fdb_kvs_handle *)0x111382;
    fVar6 = fdb_snapshot_open(pfStack_15b8,(fdb_kvs_handle **)auStack_15a8,(fdb_seqnum_t)seqnum);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001114d2;
    pfVar13 = (fdb_config *)&pphStack_1598;
    pfStack_15d0 = (fdb_kvs_handle *)0x1113a1;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_15a8._0_8_,(fdb_kvs_info *)(auStack_15a8 + 8));
    if (pphStack_1598 != seqnum) {
      pfStack_15d0 = (fdb_kvs_handle *)0x1113b2;
      snapshot_stats_test();
    }
    pcVar19 = (char *)apkStack_1590;
    if (apkStack_1590[0] != (kvs_info *)0x14) {
      pfStack_15d0 = (fdb_kvs_handle *)0x1113c6;
      snapshot_stats_test();
    }
    pcVar31 = (char *)&phStack_1578;
    if (phStack_1578 != phStack_15b0) {
      pfStack_15d0 = (fdb_kvs_handle *)0x1113e2;
      snapshot_stats_test();
    }
    unaff_R13 = auStack_15a8;
    pfStack_15d0 = (fdb_kvs_handle *)0x1113f0;
    fdb_kvs_close((fdb_kvs_handle *)auStack_15a8._0_8_);
    pfStack_15d0 = (fdb_kvs_handle *)0x111404;
    fVar6 = fdb_snapshot_open(pfStack_15b8,(fdb_kvs_handle **)unaff_R13,0xffffffffffffffff);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_15d0 = (fdb_kvs_handle *)0x11141e;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_15a8._0_8_,(fdb_kvs_info *)(auStack_15a8 + 8));
      if (pphStack_1598 != seqnum) {
        pfStack_15d0 = (fdb_kvs_handle *)0x11142f;
        snapshot_stats_test();
      }
      if (apkStack_1590[0] != (kvs_info *)0x14) {
        pfStack_15d0 = (fdb_kvs_handle *)0x11143f;
        snapshot_stats_test();
      }
      if (phStack_1578 != phStack_15b0) {
        pfStack_15d0 = (fdb_kvs_handle *)0x111458;
        snapshot_stats_test();
      }
      pfStack_15d0 = (fdb_kvs_handle *)0x111462;
      fdb_kvs_close((fdb_kvs_handle *)auStack_15a8._0_8_);
      pfStack_15d0 = (fdb_kvs_handle *)0x11146c;
      fdb_kvs_close(pfStack_15b8);
      pfStack_15d0 = (fdb_kvs_handle *)0x111476;
      fdb_close((fdb_file_handle *)phStack_15b0);
      pfStack_15d0 = (fdb_kvs_handle *)0x11147b;
      fdb_shutdown();
      pfStack_15d0 = (fdb_kvs_handle *)0x111480;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (snapshot_stats_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_15d0 = (fdb_kvs_handle *)0x1114b1;
      fprintf(_stderr,pcVar18,"snapshot stats test");
      return;
    }
  }
  else {
    pfStack_15d0 = (fdb_kvs_handle *)0x1114c8;
    snapshot_stats_test();
    pphVar5 = &phStack_15b0;
LAB_001114c8:
    seqnum = pphVar5;
    pfStack_15d0 = (fdb_kvs_handle *)0x1114cd;
    snapshot_stats_test();
LAB_001114cd:
    pfStack_15d0 = (fdb_kvs_handle *)0x1114d2;
    snapshot_stats_test();
LAB_001114d2:
    pfStack_15d0 = (fdb_kvs_handle *)0x1114d7;
    snapshot_stats_test();
  }
  pfStack_15d0 = (fdb_kvs_handle *)snapshot_with_uncomitted_data_test;
  snapshot_stats_test();
  pfStack_1998 = (fdb_kvs_handle *)0x1114fc;
  pphStack_15f8 = seqnum;
  pfStack_15f0 = (fdb_kvs_handle *)pcVar19;
  pfStack_15e8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_15e0 = pfVar13;
  pfStack_15d8 = (fdb_kvs_handle *)pcVar31;
  pfStack_15d0 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_1928 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1700 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_16f8,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1998 = (fdb_kvs_handle *)0x111524;
  system((char *)&pfStack_1700);
  pfStack_1998 = (fdb_kvs_handle *)0x111529;
  memleak_start();
  pfStack_1998 = (fdb_kvs_handle *)0x111533;
  pfVar14 = (fdb_kvs_handle *)malloc(0x20);
  pfStack_1998 = (fdb_kvs_handle *)0x111540;
  srand(0x4d2);
  pfVar9 = (fdb_kvs_handle *)(auStack_1900 + 0x108);
  pfStack_1998 = (fdb_kvs_handle *)0x111550;
  fdb_get_default_config();
  uStack_17d8 = 1;
  uStack_17e0 = '\x01';
  uStack_17b8 = 1;
  sStack_17f0 = 0;
  pfStack_1998 = (fdb_kvs_handle *)0x111570;
  fdb_get_default_kvs_config();
  pfStack_1998 = (fdb_kvs_handle *)0x111584;
  fVar6 = fdb_open(&pfStack_1970,"./mvcc_test9",(fdb_config *)pfVar9);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcVar18 = auStack_1928;
    pfStack_1998 = (fdb_kvs_handle *)0x1115a2;
    fVar6 = fdb_kvs_open(pfStack_1970,&pfStack_1980,(char *)0x0,(fdb_kvs_config *)pcVar18);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a41;
    pcVar18 = auStack_1928;
    pfStack_1998 = (fdb_kvs_handle *)0x1115c5;
    fVar6 = fdb_kvs_open(pfStack_1970,&pfStack_1978,"db1",(fdb_kvs_config *)pcVar18);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a46;
    pcVar18 = auStack_1928;
    pfStack_1998 = (fdb_kvs_handle *)0x1115e8;
    fVar6 = fdb_kvs_open(pfStack_1970,&pfStack_1988,"db2",(fdb_kvs_config *)pcVar18);
    pcVar30 = (char *)pfVar9;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a4b;
    puStack_1968 = (undefined4 *)((long)&pfVar14->kvs + 2);
    pcVar30 = "key%06d";
    pcVar31 = auStack_1900;
    pcVar19 = "value%d";
    handle._M_i = 0;
    do {
      pfStack_1998 = (fdb_kvs_handle *)0x111623;
      sprintf(pcVar31,"key%06d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar14->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1968 + 1) = 0x3e;
      *puStack_1968 = 0x646e653c;
      pfStack_1998 = (fdb_kvs_handle *)0x111651;
      sprintf((char *)pfVar14,"value%d",handle._M_i);
      pfVar9 = pfStack_1980;
      pfStack_1998 = (fdb_kvs_handle *)0x11165e;
      sVar10 = strlen(pcVar31);
      pfStack_1998 = (fdb_kvs_handle *)0x111676;
      pcVar18 = (char *)pfVar14;
      fVar6 = fdb_set_kv(pfVar9,pcVar31,sVar10 + 1,pfVar14,0x20);
      pfVar16 = pfStack_1978;
      if (fVar6 != FDB_RESULT_SUCCESS) {
        pfStack_1998 = (fdb_kvs_handle *)0x111a28;
        snapshot_with_uncomitted_data_test();
LAB_00111a28:
        unaff_R13 = (char *)pfVar9;
        pfStack_1998 = (fdb_kvs_handle *)0x111a2d;
        snapshot_with_uncomitted_data_test();
LAB_00111a2d:
        pfStack_1998 = (fdb_kvs_handle *)0x111a32;
        snapshot_with_uncomitted_data_test();
        goto LAB_00111a32;
      }
      pfStack_1998 = (fdb_kvs_handle *)0x11168b;
      sVar10 = strlen(pcVar31);
      pfStack_1998 = (fdb_kvs_handle *)0x1116a3;
      pcVar18 = (char *)pfVar14;
      fVar6 = fdb_set_kv(pfVar16,pcVar31,sVar10 + 1,pfVar14,0x20);
      unaff_R13 = (char *)pfStack_1988;
      pfVar9 = pfVar16;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a28;
      pfStack_1998 = (fdb_kvs_handle *)0x1116b8;
      sVar10 = strlen(pcVar31);
      pfStack_1998 = (fdb_kvs_handle *)0x1116d0;
      pcVar18 = (char *)pfVar14;
      fVar6 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar31,sVar10 + 1,pfVar14,0x20);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a2d;
      uVar22 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar22;
    } while (uVar22 != 10);
    pfStack_1998 = (fdb_kvs_handle *)0x1116f2;
    fVar6 = fdb_get_kvs_info(pfStack_1980,(fdb_kvs_info *)auStack_1960);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a50;
    pfStack_1998 = (fdb_kvs_handle *)0x11170c;
    fVar6 = fdb_snapshot_open(pfStack_1980,&pfStack_1990,auStack_1960._8_8_);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00111a55;
    pfStack_1998 = (fdb_kvs_handle *)0x111723;
    fVar6 = fdb_get_kvs_info(pfStack_1978,(fdb_kvs_info *)auStack_1960);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a5a;
    pfStack_1998 = (fdb_kvs_handle *)0x11173d;
    fVar6 = fdb_snapshot_open(pfStack_1978,&pfStack_1990,auStack_1960._8_8_);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00111a5f;
    pfStack_1998 = (fdb_kvs_handle *)0x111754;
    fVar6 = fdb_get_kvs_info(pfStack_1988,(fdb_kvs_info *)auStack_1960);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a64;
    pfStack_1998 = (fdb_kvs_handle *)0x11176e;
    fVar6 = fdb_snapshot_open(pfStack_1988,&pfStack_1990,auStack_1960._8_8_);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00111a69;
    pfStack_1998 = (fdb_kvs_handle *)0x111782;
    fVar6 = fdb_commit(pfStack_1970,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a6e;
    pfStack_1998 = (fdb_kvs_handle *)0x111799;
    fVar6 = fdb_get_kvs_info(pfStack_1978,(fdb_kvs_info *)auStack_1960);
    pfVar9 = (fdb_kvs_handle *)auStack_1960._8_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a73;
    pfStack_1998 = (fdb_kvs_handle *)0x1117b4;
    fVar6 = fdb_get_kvs_info(pfStack_1988,(fdb_kvs_info *)auStack_1960);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a78;
    pcVar31 = auStack_1960 + 8;
    if (pfVar9 != (fdb_kvs_handle *)auStack_1960._8_8_) {
      pfStack_1998 = (fdb_kvs_handle *)0x1117d1;
      snapshot_with_uncomitted_data_test();
    }
    pfStack_1998 = (fdb_kvs_handle *)0x1117e0;
    fVar6 = fdb_get_kvs_info(pfStack_1980,(fdb_kvs_info *)auStack_1960);
    pcVar30 = (char *)pfVar9;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a7d;
    if (pfVar9 != (fdb_kvs_handle *)auStack_1960._8_8_) {
      pfStack_1998 = (fdb_kvs_handle *)0x1117fa;
      snapshot_with_uncomitted_data_test();
    }
    pfStack_1930 = pfVar9;
    pcVar31 = "key%06d";
    pcVar19 = auStack_1900;
    unaff_R13 = "value%d";
    handle._M_i = 0;
    do {
      pfStack_1998 = (fdb_kvs_handle *)0x111826;
      sprintf(pcVar19,"key%06d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar14->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1968 + 1) = 0x3e;
      *puStack_1968 = 0x646e653c;
      pfStack_1998 = (fdb_kvs_handle *)0x111854;
      sprintf((char *)pfVar14,"value%d",handle._M_i);
      pfVar9 = pfStack_1980;
      pfStack_1998 = (fdb_kvs_handle *)0x111861;
      sVar10 = strlen(pcVar19);
      pfStack_1998 = (fdb_kvs_handle *)0x111879;
      pcVar18 = (char *)pfVar14;
      fVar6 = fdb_set_kv(pfVar9,pcVar19,sVar10 + 1,pfVar14,0x20);
      pcVar30 = (char *)pfStack_1988;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a37;
      pfStack_1998 = (fdb_kvs_handle *)0x11188e;
      sVar10 = strlen(pcVar19);
      pfStack_1998 = (fdb_kvs_handle *)0x1118a6;
      pcVar18 = (char *)pfVar14;
      fVar6 = fdb_set_kv((fdb_kvs_handle *)pcVar30,pcVar19,sVar10 + 1,pfVar14,0x20);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a32;
      uVar22 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar22;
    } while (uVar22 != 10);
    pfStack_1998 = (fdb_kvs_handle *)0x1118c8;
    fVar6 = fdb_get_kvs_info(pfStack_1978,(fdb_kvs_info *)auStack_1960);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a82;
    pfStack_1998 = (fdb_kvs_handle *)0x1118e2;
    fVar6 = fdb_snapshot_open(pfStack_1978,&pfStack_1990,auStack_1960._8_8_);
    pcVar30 = (char *)pfStack_1930;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a87;
    pfStack_1998 = (fdb_kvs_handle *)0x1118f8;
    fVar6 = fdb_kvs_close(pfStack_1990);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a8c;
    pfStack_1998 = (fdb_kvs_handle *)0x11190f;
    fVar6 = fdb_get_kvs_info(pfStack_1988,(fdb_kvs_info *)auStack_1960);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a91;
    pfStack_1998 = (fdb_kvs_handle *)0x111929;
    fVar6 = fdb_snapshot_open(pfStack_1988,&pfStack_1990,auStack_1960._8_8_);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00111a96;
    pfStack_1998 = (fdb_kvs_handle *)0x111941;
    fVar6 = fdb_snapshot_open(pfStack_1988,&pfStack_1990,(fdb_seqnum_t)pcVar30);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111a9b;
    pfStack_1998 = (fdb_kvs_handle *)0x111952;
    fVar6 = fdb_kvs_close(pfStack_1990);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111aa0;
    pfStack_1998 = (fdb_kvs_handle *)0x111969;
    fVar6 = fdb_get_kvs_info(pfStack_1980,(fdb_kvs_info *)auStack_1960);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111aa5;
    pfStack_1998 = (fdb_kvs_handle *)0x111983;
    fVar6 = fdb_snapshot_open(pfStack_1980,&pfStack_1990,auStack_1960._8_8_);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00111aaa;
    pfStack_1998 = (fdb_kvs_handle *)0x11199b;
    fVar6 = fdb_snapshot_open(pfStack_1980,&pfStack_1990,(fdb_seqnum_t)pcVar30);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111aaf;
    pfStack_1998 = (fdb_kvs_handle *)0x1119ac;
    fVar6 = fdb_kvs_close(pfStack_1990);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111ab4;
    pfStack_1998 = (fdb_kvs_handle *)0x1119be;
    fVar6 = fdb_close(pfStack_1970);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00111ab9;
    pfStack_1998 = (fdb_kvs_handle *)0x1119cb;
    fVar6 = fdb_shutdown();
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_1998 = (fdb_kvs_handle *)0x1119db;
      free(pfVar14);
      pfStack_1998 = (fdb_kvs_handle *)0x1119e0;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_1998 = (fdb_kvs_handle *)0x111a11;
      fprintf(_stderr,pcVar18,"snapshot with uncomitted data in other KVS test");
      return;
    }
  }
  else {
LAB_00111a3c:
    pfStack_1998 = (fdb_kvs_handle *)0x111a41;
    snapshot_with_uncomitted_data_test();
LAB_00111a41:
    pfStack_1998 = (fdb_kvs_handle *)0x111a46;
    snapshot_with_uncomitted_data_test();
LAB_00111a46:
    pfStack_1998 = (fdb_kvs_handle *)0x111a4b;
    snapshot_with_uncomitted_data_test();
    pcVar30 = (char *)pfVar9;
LAB_00111a4b:
    pfStack_1998 = (fdb_kvs_handle *)0x111a50;
    snapshot_with_uncomitted_data_test();
LAB_00111a50:
    pfStack_1998 = (fdb_kvs_handle *)0x111a55;
    snapshot_with_uncomitted_data_test();
LAB_00111a55:
    pfStack_1998 = (fdb_kvs_handle *)0x111a5a;
    snapshot_with_uncomitted_data_test();
LAB_00111a5a:
    pfStack_1998 = (fdb_kvs_handle *)0x111a5f;
    snapshot_with_uncomitted_data_test();
LAB_00111a5f:
    pfStack_1998 = (fdb_kvs_handle *)0x111a64;
    snapshot_with_uncomitted_data_test();
LAB_00111a64:
    pfStack_1998 = (fdb_kvs_handle *)0x111a69;
    snapshot_with_uncomitted_data_test();
LAB_00111a69:
    pfStack_1998 = (fdb_kvs_handle *)0x111a6e;
    snapshot_with_uncomitted_data_test();
LAB_00111a6e:
    pfStack_1998 = (fdb_kvs_handle *)0x111a73;
    snapshot_with_uncomitted_data_test();
LAB_00111a73:
    pfVar9 = (fdb_kvs_handle *)pcVar30;
    pfStack_1998 = (fdb_kvs_handle *)0x111a78;
    snapshot_with_uncomitted_data_test();
LAB_00111a78:
    pfStack_1998 = (fdb_kvs_handle *)0x111a7d;
    snapshot_with_uncomitted_data_test();
    pcVar30 = (char *)pfVar9;
LAB_00111a7d:
    pfStack_1998 = (fdb_kvs_handle *)0x111a82;
    snapshot_with_uncomitted_data_test();
LAB_00111a82:
    pfStack_1998 = (fdb_kvs_handle *)0x111a87;
    snapshot_with_uncomitted_data_test();
LAB_00111a87:
    pfStack_1998 = (fdb_kvs_handle *)0x111a8c;
    snapshot_with_uncomitted_data_test();
LAB_00111a8c:
    pfStack_1998 = (fdb_kvs_handle *)0x111a91;
    snapshot_with_uncomitted_data_test();
LAB_00111a91:
    pfStack_1998 = (fdb_kvs_handle *)0x111a96;
    snapshot_with_uncomitted_data_test();
LAB_00111a96:
    pfStack_1998 = (fdb_kvs_handle *)0x111a9b;
    snapshot_with_uncomitted_data_test();
LAB_00111a9b:
    pfStack_1998 = (fdb_kvs_handle *)0x111aa0;
    snapshot_with_uncomitted_data_test();
LAB_00111aa0:
    pfStack_1998 = (fdb_kvs_handle *)0x111aa5;
    snapshot_with_uncomitted_data_test();
LAB_00111aa5:
    pfStack_1998 = (fdb_kvs_handle *)0x111aaa;
    snapshot_with_uncomitted_data_test();
LAB_00111aaa:
    pfStack_1998 = (fdb_kvs_handle *)0x111aaf;
    snapshot_with_uncomitted_data_test();
LAB_00111aaf:
    pfStack_1998 = (fdb_kvs_handle *)0x111ab4;
    snapshot_with_uncomitted_data_test();
LAB_00111ab4:
    pfStack_1998 = (fdb_kvs_handle *)0x111ab9;
    snapshot_with_uncomitted_data_test();
LAB_00111ab9:
    pfStack_1998 = (fdb_kvs_handle *)0x111abe;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_1998 = (fdb_kvs_handle *)in_memory_snapshot_test;
  snapshot_with_uncomitted_data_test();
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae3;
  pfStack_19c0 = pfVar14;
  pfStack_19b8 = (fdb_kvs_handle *)pcVar19;
  pfStack_19b0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_19a8 = (fdb_kvs_handle *)pcVar30;
  pfStack_19a0 = (fdb_kvs_handle *)pcVar31;
  pfStack_1998 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_1e68 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae8;
  memleak_start();
  pcVar30 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111af7;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar13 = &fStack_1ab8;
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b07;
  fdb_get_default_config();
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b11;
  fdb_get_default_kvs_config();
  fStack_1ab8.buffercache_size = 0;
  fStack_1ab8.wal_threshold = 0x400;
  fStack_1ab8.flags = 1;
  fStack_1ab8.compaction_threshold = '\0';
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b36;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b4a;
  fVar6 = fdb_open(&pfStack_1ed0,"./mvcc_test1",pfVar13);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b66;
    fVar6 = fdb_kvs_open_default(pfStack_1ed0,&pfStack_1ee0,&fStack_1e80);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011224b;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b7f;
    fVar6 = fdb_snapshot_open(pfStack_1ee0,&pfStack_1ed8,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112250;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b96;
    fdb_get_kvs_info(pfStack_1ed8,&fStack_1eb0);
    if ((fdb_config *)fStack_1eb0.last_seqnum != (fdb_config *)0x0) {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ba6;
      in_memory_snapshot_test();
    }
    pcVar30 = auStack_1ec8;
    pcVar18 = (char *)0x0;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bc9;
    fdb_iterator_init(pfStack_1ed8,(fdb_iterator **)pcVar30,(void *)0x0,0,(void *)0x0,0,0);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bd6;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1ec8._0_8_,(fdb_doc **)(auStack_1ec8 + 8));
    _Var15._M_i = (__int_type)pfVar13;
    if (fVar6 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112255;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111be9;
    fdb_iterator_close((fdb_iterator *)auStack_1ec8._0_8_);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf3;
    fdb_kvs_close(pfStack_1ed8);
    lVar21 = 0;
    uVar20 = 0;
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
      sprintf(acStack_1db8,"key%d",uVar20 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c31;
      sprintf(auStack_1cb8,"meta%d",uVar20 & 0xffffffff);
      pcVar18 = auStack_1cb8 + 0x100;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c4d;
      sprintf(pcVar18,"body%d",uVar20 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c60;
      sVar10 = strlen(acStack_1db8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c6b;
      sVar11 = strlen(auStack_1cb8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c76;
      sVar12 = strlen(pcVar18);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c9b;
      fdb_doc_create((fdb_doc **)(auStack_1e68 + lVar21),acStack_1db8,sVar10,auStack_1cb8,sVar11,
                     pcVar18,sVar12);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cad;
      fdb_set(pfStack_1ee0,*(fdb_doc **)(auStack_1e68 + uVar20 * 8));
      uVar20 = uVar20 + 1;
      lVar21 = lVar21 + 8;
    } while (uVar20 != 5);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ccd;
    fdb_commit(pfStack_1ed0,'\x01');
    uVar20 = 5;
    ppfVar28 = (fdb_doc **)(auStack_1e68 + 0x28);
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
      sprintf(acStack_1db8,"key%d",uVar20 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d13;
      sprintf(auStack_1cb8,"meta%d",uVar20 & 0xffffffff);
      pcVar18 = auStack_1cb8 + 0x100;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d2f;
      sprintf(pcVar18,"body%d",uVar20 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d37;
      sVar10 = strlen(acStack_1db8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d42;
      sVar11 = strlen(auStack_1cb8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d4d;
      sVar12 = strlen(pcVar18);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6d;
      fdb_doc_create(ppfVar28,acStack_1db8,sVar10,auStack_1cb8,sVar11,pcVar18,sVar12);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d7a;
      fdb_set(pfStack_1ee0,*ppfVar28);
      uVar20 = uVar20 + 1;
      ppfVar28 = ppfVar28 + 1;
    } while (uVar20 != 9);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
    sprintf(acStack_1db8,"key%d",9);
    pcVar31 = auStack_1cb8;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dc7;
    sprintf(pcVar31,"meta%d",9);
    pcVar19 = auStack_1cb8 + 0x100;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111de5;
    sprintf(pcVar19,"Body%d",9);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111df5;
    unaff_R13 = (char *)strlen(acStack_1db8);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e00;
    handle._M_i = strlen(pcVar31);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e0b;
    sVar10 = strlen(pcVar19);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e26;
    pcVar18 = pcVar31;
    fdb_doc_create((fdb_doc **)(auStack_1e68 + 0x48),acStack_1db8,(size_t)unaff_R13,pcVar31,
                   handle._M_i,pcVar19,sVar10);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e33;
    fdb_set(pfStack_1ee0,(fdb_doc *)auStack_1e68._72_8_);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3f;
    fdb_commit(pfStack_1ed0,'\0');
    **(undefined1 **)(auStack_1e68._72_8_ + 0x40) = 0x62;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e56;
    fdb_set(pfStack_1ee0,(fdb_doc *)auStack_1e68._72_8_);
    _Var15._M_i = *(fdb_seqnum_t *)(auStack_1e68._72_8_ + 0x28);
    pcVar30 = (char *)&fStack_1eb0;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e6f;
    fdb_get_kvs_info(pfStack_1ee0,(fdb_kvs_info *)pcVar30);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e82;
    fVar6 = fdb_snapshot_open(pfStack_1ee0,&pfStack_1ed8,fStack_1eb0.last_seqnum);
    if (fVar6 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0011225a;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ea6;
    pfStack_1eb8 = (fdb_config *)_Var15._M_i;
    fVar6 = fdb_snapshot_open(pfStack_1ee0,&pfStack_1ed8,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011225f;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eba;
    fdb_commit(pfStack_1ed0,'\0');
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ecc;
    fdb_set(pfStack_1ee0,(fdb_doc *)auStack_1e68._72_8_);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed8;
    fdb_commit(pfStack_1ed0,'\0');
    uVar20 = 10;
    pcVar30 = (char *)0x50;
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eff;
      sprintf(acStack_1db8,"key%d",uVar20 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f1b;
      sprintf(auStack_1cb8,"meta%d",uVar20 & 0xffffffff);
      pcVar19 = auStack_1cb8 + 0x100;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f37;
      sprintf(pcVar19,"body%d",uVar20 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_1e68 + (long)pcVar30);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4a;
      _Var15._M_i = strlen(acStack_1db8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f55;
      unaff_R13 = (char *)strlen(auStack_1cb8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f60;
      sVar10 = strlen(pcVar19);
      pcVar18 = auStack_1cb8;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f85;
      fdb_doc_create((fdb_doc **)handle._M_i,acStack_1db8,_Var15._M_i,pcVar18,(size_t)unaff_R13,
                     pcVar19,sVar10);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f97;
      fdb_set(pfStack_1ee0,*(fdb_doc **)(auStack_1e68 + uVar20 * 8));
      uVar20 = uVar20 + 1;
      pcVar30 = (char *)((long)pcVar30 + 8);
    } while (uVar20 != 0xf);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc0;
    fVar6 = fdb_set_log_callback(pfStack_1ee0,logCallbackFunc,"in_memory_snapshot_test");
    pcVar31 = (char *)0xf;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112264;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_get_kvs_info(pfStack_1ed8,&fStack_1eb0);
    if ((fdb_config *)fStack_1eb0.last_seqnum != pfStack_1eb8) {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fef;
      in_memory_snapshot_test();
    }
    uVar20 = 0xf;
    pfVar13 = (fdb_config *)(auStack_1e68 + 0x78);
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112017;
      sprintf(acStack_1db8,"key%d",uVar20 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112032;
      sprintf(auStack_1cb8,"meta%d",uVar20 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_1cb8 + 0x100);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11204d;
      sprintf((char *)handle._M_i,"body%d",uVar20 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112055;
      pcVar31 = (char *)strlen(acStack_1db8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112060;
      pcVar19 = (char *)strlen(auStack_1cb8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206b;
      sVar10 = strlen((char *)handle._M_i);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11208b;
      fdb_doc_create((fdb_doc **)pfVar13,acStack_1db8,(size_t)pcVar31,auStack_1cb8,(size_t)pcVar19,
                     (void *)handle._M_i,sVar10);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112098;
      fdb_set(pfStack_1ee0,*(fdb_doc **)pfVar13);
      uVar20 = uVar20 + 1;
      pfVar13 = (fdb_config *)((long)pfVar13 + 8);
    } while (uVar20 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120b8;
    fdb_commit(pfStack_1ed0,'\0');
    pcVar18 = (char *)0x0;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120d8;
    fdb_iterator_init(pfStack_1ed8,(fdb_iterator **)auStack_1ec8,(void *)0x0,0,(void *)0x0,0,0);
    pcVar30 = auStack_1ec8 + 8;
    auStack_1ec8._8_8_ = (fdb_config *)0x0;
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120f1;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1ec8._0_8_,(fdb_doc **)pcVar30);
      _Var15._M_i = auStack_1ec8._8_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_0011222b:
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112230
        ;
        in_memory_snapshot_test();
LAB_00112230:
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11223b
        ;
        in_memory_snapshot_test();
LAB_0011223b:
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112246
        ;
        in_memory_snapshot_test();
        goto LAB_00112246;
      }
      pcVar31 = *(char **)(auStack_1ec8._8_8_ + 0x20);
      handle._M_i = *(__int_type *)(auStack_1e68 + (long)unaff_R13 * 8);
      pcVar19 = (char *)((fdb_kvs_handle *)handle._M_i)->op_stats;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11211c;
      iVar7 = bcmp(pcVar31,pcVar19,*(size_t *)auStack_1ec8._8_8_);
      pfVar13 = (fdb_config *)_Var15._M_i;
      if (iVar7 != 0) {
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222b
        ;
        in_memory_snapshot_test();
        goto LAB_0011222b;
      }
      pcVar31 = *(char **)(_Var15._M_i + 0x38);
      pcVar19 = (char *)((fdb_kvs_handle *)handle._M_i)->staletree;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11213b;
      iVar7 = bcmp(pcVar31,pcVar19,*(uint64_t *)(_Var15._M_i + 8));
      if (iVar7 != 0) goto LAB_0011223b;
      pcVar31 = *(char **)(_Var15._M_i + 0x40);
      pcVar19 = (char *)(((fdb_kvs_handle *)handle._M_i)->field_6).seqtree;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215a;
      iVar7 = bcmp(pcVar31,pcVar19,*(uint64_t *)(_Var15._M_i + 0x10));
      if (iVar7 != 0) goto LAB_00112230;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216a;
      fdb_doc_free((fdb_doc *)_Var15._M_i);
      auStack_1ec8._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112180;
      fVar6 = fdb_iterator_next((fdb_iterator *)auStack_1ec8._0_8_);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11219d;
      fdb_iterator_close((fdb_iterator *)auStack_1ec8._0_8_);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a7;
      fdb_kvs_close(pfStack_1ee0);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121b1;
      fdb_kvs_close(pfStack_1ed8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121bb;
      fdb_close(pfStack_1ed0);
      lVar21 = 0;
      do {
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ca
        ;
        fdb_doc_free(*(fdb_doc **)(auStack_1e68 + lVar21 * 8));
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x14);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121d8;
      fdb_shutdown();
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121dd;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11220e;
      fprintf(_stderr,pcVar18,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112246:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11224b;
    in_memory_snapshot_test();
LAB_0011224b:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112250;
    in_memory_snapshot_test();
LAB_00112250:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112255;
    in_memory_snapshot_test();
    _Var15._M_i = (__int_type)pfVar13;
LAB_00112255:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225a;
    in_memory_snapshot_test();
LAB_0011225a:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225f;
    in_memory_snapshot_test();
LAB_0011225f:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112264;
    in_memory_snapshot_test();
LAB_00112264:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112269;
    in_memory_snapshot_test();
  }
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle_00 = (char *)0x0;
  pfStack_2118 = (fdb_kvs_handle *)0x112291;
  pfStack_1f18 = (fdb_kvs_info *)pcVar30;
  aStack_1f10.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)pcVar19;
  pfStack_1f08 = (fdb_kvs_handle *)unaff_R13;
  aStack_1f00.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var15._M_i;
  pfStack_1ef8 = (fdb_kvs_handle *)pcVar31;
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)handle._M_i;
  gettimeofday(&tStack_2040,(__timezone_ptr_t)0x0);
  pfStack_2118 = (fdb_kvs_handle *)0x112296;
  memleak_start();
  aStack_20f8.seqtree = (btree *)0x0;
  pcVar31 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_2118 = (fdb_kvs_handle *)0x1122aa;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar9 = (fdb_kvs_handle *)&fStack_2030.seqtree_opt;
  pfStack_2118 = (fdb_kvs_handle *)0x1122ba;
  fdb_get_default_config();
  pfStack_2118 = (fdb_kvs_handle *)0x1122c4;
  fdb_get_default_kvs_config();
  fStack_2030.compaction_minimum_filesize = 0x400;
  fStack_2030._68_4_ = 1;
  fStack_2030.prefetch_duration._7_1_ = '\0';
  fStack_2030.breakpad_minidump_dir = (char *)0x0;
  pfStack_2118 = (fdb_kvs_handle *)0x1122e8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_2118 = (fdb_kvs_handle *)0x1122fc;
  fVar6 = fdb_open(&pfStack_2100,"./mvcc_test1",(fdb_config *)pfVar9);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfStack_2118 = (fdb_kvs_handle *)0x112318;
    fVar6 = fdb_kvs_open_default(pfStack_2100,&pfStack_2108,&fStack_20b8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126ac;
    pfStack_2118 = (fdb_kvs_handle *)0x112338;
    fVar6 = fdb_set_log_callback(pfStack_2108,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126b1;
    pcVar31 = (char *)aaStack_2060;
    aaStack_2060[0]._0_4_ = 0x79656b;
    pfVar9 = (fdb_kvs_handle *)&fStack_2080;
    fStack_2080._4_1_ = 0;
    fStack_2080.create_if_missing = true;
    fStack_2080._1_3_ = 0x617465;
    handle_00 = &fStack_20a0.create_if_missing;
    fStack_20a0._4_1_ = 0;
    fStack_20a0.create_if_missing = true;
    fStack_20a0._1_3_ = 0x79646f;
    pfStack_2118 = (fdb_kvs_handle *)0x11237b;
    pcVar19 = (char *)strlen(pcVar31);
    pfStack_2118 = (fdb_kvs_handle *)0x112386;
    unaff_R13 = (char *)strlen((char *)pfVar9);
    pfStack_2118 = (fdb_kvs_handle *)0x112391;
    sVar10 = strlen(handle_00);
    handle._M_i = (__int_type)&aStack_20f8;
    pfStack_2118 = (fdb_kvs_handle *)0x1123b1;
    pcVar18 = (char *)pfVar9;
    fdb_doc_create((fdb_doc **)handle._M_i,pcVar31,(size_t)pcVar19,pfVar9,(size_t)unaff_R13,
                   handle_00,sVar10);
    pfStack_2118 = (fdb_kvs_handle *)0x1123bf;
    fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    pfStack_2118 = (fdb_kvs_handle *)0x1123cb;
    fdb_commit(pfStack_2100,'\0');
    pfStack_2118 = (fdb_kvs_handle *)0x1123e1;
    fVar6 = fdb_snapshot_open(pfStack_2108,&pfStack_20d8,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126b6;
    pfStack_2118 = (fdb_kvs_handle *)0x1123f8;
    fVar6 = fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126bb;
    pfStack_2118 = (fdb_kvs_handle *)0x11240c;
    fVar6 = fdb_commit(pfStack_2100,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126c0;
    pfStack_2118 = (fdb_kvs_handle *)0x11242a;
    fVar6 = fdb_snapshot_open(pfStack_2108,&pfStack_20e0,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126c5;
    pfStack_2118 = (fdb_kvs_handle *)0x112441;
    fVar6 = fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126ca;
    pfStack_2118 = (fdb_kvs_handle *)0x112455;
    fVar6 = fdb_commit(pfStack_2100,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126cf;
    pfStack_2118 = (fdb_kvs_handle *)0x11246c;
    fVar6 = fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126d4;
    pfStack_2118 = (fdb_kvs_handle *)0x112480;
    fVar6 = fdb_commit(pfStack_2100,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126d9;
    pcVar31 = (char *)&aStack_20f8;
    pfStack_2118 = (fdb_kvs_handle *)0x112495;
    fdb_doc_free((fdb_doc *)aStack_20f8.seqtree);
    pfVar9 = (fdb_kvs_handle *)&fStack_2030;
    fStack_2030.chunksize = 0x654b;
    fStack_2030._2_2_ = 0x79;
    pfStack_2118 = (fdb_kvs_handle *)0x1124ac;
    handle_00 = (char *)strlen((char *)pfVar9);
    pcVar19 = &fStack_2080.create_if_missing;
    pfStack_2118 = (fdb_kvs_handle *)0x1124bf;
    unaff_R13 = (char *)strlen(pcVar19);
    handle._M_i = (__int_type)&fStack_20a0;
    pfStack_2118 = (fdb_kvs_handle *)0x1124cf;
    sVar10 = strlen((char *)handle._M_i);
    pfStack_2118 = (fdb_kvs_handle *)0x1124ea;
    pcVar18 = pcVar19;
    fdb_doc_create((fdb_doc **)pcVar31,pfVar9,(size_t)handle_00,pcVar19,(size_t)unaff_R13,
                   (void *)handle._M_i,sVar10);
    pfStack_2118 = (fdb_kvs_handle *)0x1124f7;
    fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    pfStack_2118 = (fdb_kvs_handle *)0x11250d;
    fVar6 = fdb_snapshot_open(pfStack_2108,&pfStack_20e8,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126de;
    pcVar31 = (char *)aaStack_2060;
    pfStack_2118 = (fdb_kvs_handle *)0x112525;
    sVar10 = strlen(pcVar31);
    pfVar9 = (fdb_kvs_handle *)&pfStack_20f0;
    pcVar18 = (char *)0x0;
    pfStack_2118 = (fdb_kvs_handle *)0x112548;
    fdb_doc_create((fdb_doc **)pfVar9,pcVar31,sVar10,(void *)0x0,0,(void *)0x0,0);
    pfStack_2118 = (fdb_kvs_handle *)0x112555;
    fVar6 = fdb_get(pfStack_20d8,pfStack_20f0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126e3;
    pfStack_2118 = (fdb_kvs_handle *)0x11256c;
    fVar6 = fdb_get(pfStack_20e0,pfStack_20f0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126e8;
    pfStack_2118 = (fdb_kvs_handle *)0x112583;
    fVar6 = fdb_get(pfStack_20e8,pfStack_20f0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126ed;
    pfStack_2118 = (fdb_kvs_handle *)0x112595;
    fdb_doc_free(pfStack_20f0);
    pfStack_2118 = (fdb_kvs_handle *)0x1125a9;
    fVar6 = fdb_snapshot_open(pfStack_2108,&pfStack_20c0,1);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126f2;
    pfStack_2118 = (fdb_kvs_handle *)0x1125c5;
    fVar6 = fdb_snapshot_open(pfStack_2108,&pfStack_20c8,2);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126f7;
    pfStack_2118 = (fdb_kvs_handle *)0x1125e1;
    fVar6 = fdb_snapshot_open(pfStack_2108,&pfStack_20d0,3);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001126fc;
    pfStack_2118 = (fdb_kvs_handle *)0x1125f3;
    fdb_kvs_close(pfStack_20d8);
    pfStack_2118 = (fdb_kvs_handle *)0x1125fd;
    fdb_kvs_close(pfStack_20e0);
    pfStack_2118 = (fdb_kvs_handle *)0x112607;
    fdb_kvs_close(pfStack_20e8);
    pfStack_2118 = (fdb_kvs_handle *)0x112616;
    fVar6 = fdb_commit(pfStack_2100,'\x01');
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_2118 = (fdb_kvs_handle *)0x112628;
      fdb_kvs_close(pfStack_20c0);
      pfStack_2118 = (fdb_kvs_handle *)0x112632;
      fdb_kvs_close(pfStack_20c8);
      pfStack_2118 = (fdb_kvs_handle *)0x11263c;
      fdb_kvs_close(pfStack_20d0);
      pfStack_2118 = (fdb_kvs_handle *)0x112646;
      fdb_kvs_close(pfStack_2108);
      pfStack_2118 = (fdb_kvs_handle *)0x112650;
      fdb_close(pfStack_2100);
      pfStack_2118 = (fdb_kvs_handle *)0x11265a;
      fdb_doc_free((fdb_doc *)aStack_20f8.seqtree);
      pfStack_2118 = (fdb_kvs_handle *)0x11265f;
      fdb_shutdown();
      pfStack_2118 = (fdb_kvs_handle *)0x112664;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_2118 = (fdb_kvs_handle *)0x112695;
      fprintf(_stderr,pcVar18,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_2118 = (fdb_kvs_handle *)0x1126ac;
    in_memory_snapshot_cleanup_test();
LAB_001126ac:
    pfStack_2118 = (fdb_kvs_handle *)0x1126b1;
    in_memory_snapshot_cleanup_test();
LAB_001126b1:
    pfStack_2118 = (fdb_kvs_handle *)0x1126b6;
    in_memory_snapshot_cleanup_test();
LAB_001126b6:
    pfStack_2118 = (fdb_kvs_handle *)0x1126bb;
    in_memory_snapshot_cleanup_test();
LAB_001126bb:
    pfStack_2118 = (fdb_kvs_handle *)0x1126c0;
    in_memory_snapshot_cleanup_test();
LAB_001126c0:
    pfStack_2118 = (fdb_kvs_handle *)0x1126c5;
    in_memory_snapshot_cleanup_test();
LAB_001126c5:
    pfStack_2118 = (fdb_kvs_handle *)0x1126ca;
    in_memory_snapshot_cleanup_test();
LAB_001126ca:
    pfStack_2118 = (fdb_kvs_handle *)0x1126cf;
    in_memory_snapshot_cleanup_test();
LAB_001126cf:
    pfStack_2118 = (fdb_kvs_handle *)0x1126d4;
    in_memory_snapshot_cleanup_test();
LAB_001126d4:
    pfStack_2118 = (fdb_kvs_handle *)0x1126d9;
    in_memory_snapshot_cleanup_test();
LAB_001126d9:
    pfStack_2118 = (fdb_kvs_handle *)0x1126de;
    in_memory_snapshot_cleanup_test();
LAB_001126de:
    pfStack_2118 = (fdb_kvs_handle *)0x1126e3;
    in_memory_snapshot_cleanup_test();
LAB_001126e3:
    pfStack_2118 = (fdb_kvs_handle *)0x1126e8;
    in_memory_snapshot_cleanup_test();
LAB_001126e8:
    pfStack_2118 = (fdb_kvs_handle *)0x1126ed;
    in_memory_snapshot_cleanup_test();
LAB_001126ed:
    pfStack_2118 = (fdb_kvs_handle *)0x1126f2;
    in_memory_snapshot_cleanup_test();
LAB_001126f2:
    pfStack_2118 = (fdb_kvs_handle *)0x1126f7;
    in_memory_snapshot_cleanup_test();
LAB_001126f7:
    pfStack_2118 = (fdb_kvs_handle *)0x1126fc;
    in_memory_snapshot_cleanup_test();
LAB_001126fc:
    pfStack_2118 = (fdb_kvs_handle *)0x112701;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_2118 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_24e0 = (fdb_kvs_handle *)0x112726;
  paStack_2140 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar31;
  pfStack_2138 = (fdb_kvs_handle *)pcVar19;
  pfStack_2130 = (fdb_kvs_handle *)unaff_R13;
  pfStack_2128 = pfVar9;
  pfStack_2120 = (fdb_kvs_handle *)handle_00;
  pfStack_2118 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_2458,(__timezone_ptr_t)0x0);
  pfStack_2248 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_2240,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_24e0 = (fdb_kvs_handle *)0x11274e;
  system((char *)&pfStack_2248);
  pfStack_24e0 = (fdb_kvs_handle *)0x112753;
  memleak_start();
  pfStack_24e0 = (fdb_kvs_handle *)0x11275d;
  pfVar14 = (fdb_kvs_handle *)malloc(0x20);
  pfVar9 = (fdb_kvs_handle *)(auStack_2448 + 0x108);
  pfStack_24e0 = (fdb_kvs_handle *)0x112770;
  fdb_get_default_config();
  uStack_2320._0_1_ = true;
  uStack_2320._1_1_ = true;
  uStack_2328 = '\x01';
  pcStack_2330 = (char *)0x3c;
  uStack_2300 = 1;
  sStack_2338 = 0;
  pfStack_24e0 = (fdb_kvs_handle *)0x11279b;
  fdb_get_default_kvs_config();
  pfStack_24e0 = (fdb_kvs_handle *)0x1127af;
  fVar6 = fdb_open(&pfStack_2490,"./mvcc_test",(fdb_config *)pfVar9);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcVar18 = auStack_2478 + 8;
    pfStack_24e0 = (fdb_kvs_handle *)0x1127d2;
    fVar6 = fdb_kvs_open(pfStack_2490,&pfStack_24a8,"db",(fdb_kvs_config *)pcVar18);
    pcVar31 = (char *)pfVar9;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112fda;
    puStack_24b0 = (undefined4 *)((long)&pfVar14->kvs + 2);
    pcVar31 = "k%05d";
    handle_00 = auStack_2448;
    pcVar19 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_24e0 = (fdb_kvs_handle *)0x11280d;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar14->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x11283b;
      sprintf((char *)pfVar14,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_24a8;
      pfStack_24e0 = (fdb_kvs_handle *)0x112848;
      sVar10 = strlen(handle_00);
      pfStack_24e0 = (fdb_kvs_handle *)0x112860;
      pcVar18 = (char *)pfVar14;
      fVar6 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar10 + 1,pfVar14,0x20);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112f50;
      uVar22 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar22;
    } while (uVar22 != 0x1e);
    pfStack_24e0 = (fdb_kvs_handle *)0x11287e;
    fVar6 = fdb_commit(pfStack_2490,'\x01');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112fdf;
    pfStack_24e0 = (fdb_kvs_handle *)0x11289c;
    fVar6 = fdb_snapshot_open(pfStack_24a8,&pfStack_24b8,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112fe4;
    pfStack_24e0 = (fdb_kvs_handle *)0x1128ba;
    fVar6 = fdb_snapshot_open(pfStack_24b8,&pfStack_24a0,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112fe9;
    handle._M_i = 0x1e;
    pcVar31 = "k%05d";
    handle_00 = auStack_2448;
    pcVar19 = "value%08d";
    do {
      pfStack_24e0 = (fdb_kvs_handle *)0x1128ec;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar14->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x11291a;
      sprintf((char *)pfVar14,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_24a8;
      pfStack_24e0 = (fdb_kvs_handle *)0x112927;
      sVar10 = strlen(handle_00);
      pfStack_24e0 = (fdb_kvs_handle *)0x11293f;
      pcVar18 = (char *)pfVar14;
      fVar6 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar10 + 1,pfVar14,0x20);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112f55;
      uVar22 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar22;
    } while (uVar22 != 300);
    pfStack_24e0 = (fdb_kvs_handle *)0x11296f;
    sprintf((char *)auStack_2448,"k%05d",0x1e);
    handle_00 = (char *)pfStack_24b8;
    pfStack_24e0 = (fdb_kvs_handle *)0x11297c;
    sVar10 = strlen((char *)auStack_2448);
    pcVar18 = auStack_2478;
    pfStack_24e0 = (fdb_kvs_handle *)0x112995;
    fVar6 = fdb_get_kv((fdb_kvs_handle *)handle_00,(fdb_kvs_handle *)auStack_2448,sVar10 + 1,
                       (void **)pcVar18,&sStack_2480);
    pcVar31 = (char *)pfStack_24a0;
    pfVar9 = (fdb_kvs_handle *)auStack_2448;
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00112fee;
    handle_00 = auStack_2448;
    pfStack_24e0 = (fdb_kvs_handle *)0x1129b2;
    sVar10 = strlen(handle_00);
    pcVar18 = auStack_2478;
    pfStack_24e0 = (fdb_kvs_handle *)0x1129cb;
    fVar6 = fdb_get_kv((fdb_kvs_handle *)pcVar31,handle_00,sVar10 + 1,(void **)pcVar18,&sStack_2480)
    ;
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00112ff3;
    pfStack_24e0 = (fdb_kvs_handle *)0x1129dd;
    fVar6 = fdb_kvs_close(pfStack_24b8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112ff8;
    pfStack_24e0 = (fdb_kvs_handle *)0x1129ef;
    fVar6 = fdb_kvs_close(pfStack_24a0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112ffd;
    pfStack_24e0 = (fdb_kvs_handle *)0x112a0d;
    fVar6 = fdb_snapshot_open(pfStack_24a8,&pfStack_24b8,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113002;
    pcVar18 = (char *)0x0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112a35;
    fVar6 = fdb_iterator_init(pfStack_24b8,&pfStack_24c0,(void *)0x0,0,(void *)0x0,0,0);
    pfVar9 = (fdb_kvs_handle *)pcVar31;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113007;
    pcVar19 = auStack_2448;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_24d0 = (fdb_kvs_handle *)0x0;
      pfStack_24e0 = (fdb_kvs_handle *)0x112a66;
      fVar6 = fdb_iterator_get(pfStack_24c0,(fdb_doc **)&pfStack_24d0);
      pfVar9 = (fdb_kvs_handle *)pcVar31;
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      pfStack_24e0 = (fdb_kvs_handle *)0x112a81;
      sprintf(pcVar19,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar14->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x112aaf;
      sprintf((char *)pfVar14,"value%08d",handle._M_i);
      pcVar31 = (char *)pfStack_24d0;
      handle_00 = (char *)pfStack_24d0->op_stats;
      pfStack_24e0 = (fdb_kvs_handle *)0x112ac6;
      iVar7 = bcmp(handle_00,pcVar19,*(size_t *)&pfStack_24d0->kvs_config);
      if (iVar7 != 0) goto LAB_00112f5a;
      handle_00 = (char *)(((fdb_kvs_handle *)pcVar31)->field_6).seqtree;
      pfStack_24e0 = (fdb_kvs_handle *)0x112ae1;
      iVar7 = bcmp(handle_00,pfVar14,
                   (size_t)(((fdb_kvs_handle *)pcVar31)->kvs_config).custom_cmp_param);
      if (iVar7 != 0) goto LAB_00112f6a;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_24e0 = (fdb_kvs_handle *)0x112af3;
      fdb_doc_free((fdb_doc *)pcVar31);
      pfStack_24e0 = (fdb_kvs_handle *)0x112afd;
      fVar6 = fdb_iterator_next(pfStack_24c0);
      pfVar9 = (fdb_kvs_handle *)pcVar31;
    } while (fVar6 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_0011300c;
    pfStack_24e0 = (fdb_kvs_handle *)0x112b1b;
    fVar6 = fdb_iterator_close(pfStack_24c0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113011;
    pfStack_24e0 = (fdb_kvs_handle *)0x112b39;
    fVar6 = fdb_snapshot_open(pfStack_24b8,&pfStack_24a0,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113016;
    pcVar18 = (char *)0x0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112b61;
    fVar6 = fdb_iterator_init(pfStack_24b8,&pfStack_24c0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011301b;
    pcVar18 = (char *)0x0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112b89;
    fVar6 = fdb_iterator_init(pfStack_24a0,&pfStack_2488,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113020;
    pcVar18 = (char *)0x0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112bb1;
    fVar6 = fdb_iterator_init(pfStack_24a8,&pfStack_2498,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113025;
    pcVar19 = auStack_2448;
    unaff_R13 = "value%08d";
    handle_00 = "k%06d";
    uStack_24c4 = 0;
    do {
      pfStack_24d0 = (fdb_kvs_handle *)0x0;
      pfStack_24e0 = (fdb_kvs_handle *)0x112bef;
      fVar6 = fdb_iterator_get(pfStack_24c0,(fdb_doc **)&pfStack_24d0);
      uVar22 = uStack_24c4;
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      pfStack_24e0 = (fdb_kvs_handle *)0x112c0e;
      sprintf(pcVar19,"k%05d",(ulong)uStack_24c4);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar14->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x112c3c;
      sprintf((char *)pfVar14,"value%08d",(ulong)uVar22);
      pcVar31 = (char *)pfStack_24d0;
      handle._M_i = (__int_type)pfStack_24d0->op_stats;
      pfStack_24e0 = (fdb_kvs_handle *)0x112c53;
      iVar7 = bcmp((void *)handle._M_i,pcVar19,*(size_t *)&pfStack_24d0->kvs_config);
      if (iVar7 != 0) goto LAB_00112f75;
      handle._M_i = (__int_type)(((fdb_kvs_handle *)pcVar31)->field_6).seqtree;
      pfStack_24e0 = (fdb_kvs_handle *)0x112c6e;
      iVar7 = bcmp((void *)handle._M_i,pfVar14,
                   (size_t)(((fdb_kvs_handle *)pcVar31)->kvs_config).custom_cmp_param);
      pfVar9 = (fdb_kvs_handle *)pcVar31;
      if (iVar7 != 0) goto LAB_00112fa5;
      pfStack_24e0 = (fdb_kvs_handle *)0x112c7e;
      fdb_doc_free((fdb_doc *)pcVar31);
      pfStack_24d0 = (fdb_kvs_handle *)0x0;
      pfStack_24e0 = (fdb_kvs_handle *)0x112c96;
      fVar6 = fdb_iterator_get(pfStack_24c0,(fdb_doc **)&pfStack_24d0);
      pfVar9 = pfStack_24d0;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112f85;
      handle._M_i = (__int_type)pfStack_24d0->op_stats;
      pfStack_24e0 = (fdb_kvs_handle *)0x112cb5;
      iVar7 = bcmp((void *)handle._M_i,pcVar19,*(size_t *)&pfStack_24d0->kvs_config);
      if (iVar7 != 0) goto LAB_00112f8a;
      handle._M_i = (__int_type)(pfVar9->field_6).seqtree;
      pfStack_24e0 = (fdb_kvs_handle *)0x112cd0;
      iVar7 = bcmp((void *)handle._M_i,pfVar14,(size_t)(pfVar9->kvs_config).custom_cmp_param);
      if (iVar7 != 0) goto LAB_00112f9a;
      uVar22 = uStack_24c4 + 1;
      handle._M_i = (__int_type)uVar22;
      pfStack_24e0 = (fdb_kvs_handle *)0x112ce6;
      fdb_doc_free((fdb_doc *)pfVar9);
      uStack_24c4 = uVar22;
      if (uVar22 == 0x3c) {
        pcVar31 = (char *)0x0;
        do {
          pfStack_24e0 = (fdb_kvs_handle *)0x112d02;
          sprintf(pcVar19,"k%06d",pcVar31);
          *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
          *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
          *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
          *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
          *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
          *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
          *(undefined4 *)&pfVar14->kvs = 0x78787878;
          *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
          *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
          *puStack_24b0 = 0x646e653c;
          pfStack_24e0 = (fdb_kvs_handle *)0x112d31;
          sprintf((char *)pfVar14,"value%08d",pcVar31);
          handle._M_i = (__int_type)pfStack_24a8;
          pfStack_24e0 = (fdb_kvs_handle *)0x112d3e;
          sVar10 = strlen(pcVar19);
          pfStack_24e0 = (fdb_kvs_handle *)0x112d56;
          pcVar18 = (char *)pfVar14;
          fVar6 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar19,sVar10 + 1,pfVar14,0x20);
          if (fVar6 != FDB_RESULT_SUCCESS) {
            pfStack_24e0 = (fdb_kvs_handle *)0x112f50;
            in_memory_snapshot_on_dirty_hbtrie_test();
            goto LAB_00112f50;
          }
          uVar22 = (int)pcVar31 + 1;
          pcVar31 = (char *)(ulong)uVar22;
        } while (uVar22 != 3000);
      }
      pfStack_24e0 = (fdb_kvs_handle *)0x112d74;
      fVar6 = fdb_iterator_next(pfStack_24c0);
      pfVar9 = (fdb_kvs_handle *)(ulong)(uint)fVar6;
      pfStack_24e0 = (fdb_kvs_handle *)0x112d81;
      fVar8 = fdb_iterator_next(pfStack_2488);
      if (fVar6 == FDB_RESULT_SUCCESS) {
        if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_00112fd0;
      }
      else if (fVar8 == FDB_RESULT_SUCCESS) goto LAB_00112fcb;
    } while (fVar6 == FDB_RESULT_SUCCESS);
    if (uStack_24c4 != 300) goto LAB_0011302a;
    pfStack_24e0 = (fdb_kvs_handle *)0x112db8;
    fVar6 = fdb_iterator_close(pfStack_24c0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011302f;
    pfStack_24e0 = (fdb_kvs_handle *)0x112dca;
    fVar6 = fdb_iterator_close(pfStack_2488);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113034;
    pcVar19 = auStack_2448;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_24d0 = (fdb_kvs_handle *)0x0;
      pfStack_24e0 = (fdb_kvs_handle *)0x112dfb;
      fVar6 = fdb_iterator_get(pfStack_2498,(fdb_doc **)&pfStack_24d0);
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      pfStack_24e0 = (fdb_kvs_handle *)0x112e16;
      sprintf(pcVar19,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar14->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x112e44;
      sprintf((char *)pfVar14,"value%08d",handle._M_i);
      pfVar9 = pfStack_24d0;
      handle_00 = (char *)pfStack_24d0->op_stats;
      pfStack_24e0 = (fdb_kvs_handle *)0x112e5b;
      iVar7 = bcmp(handle_00,pcVar19,*(size_t *)&pfStack_24d0->kvs_config);
      if (iVar7 != 0) goto LAB_00112fb0;
      handle_00 = (char *)(pfVar9->field_6).seqtree;
      pfStack_24e0 = (fdb_kvs_handle *)0x112e76;
      iVar7 = bcmp(handle_00,pfVar14,(size_t)(pfVar9->kvs_config).custom_cmp_param);
      if (iVar7 != 0) goto LAB_00112fc0;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_24e0 = (fdb_kvs_handle *)0x112e88;
      fdb_doc_free((fdb_doc *)pfVar9);
      pfStack_24e0 = (fdb_kvs_handle *)0x112e92;
      fVar6 = fdb_iterator_next(pfStack_2498);
    } while (fVar6 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_00113039;
    pfStack_24e0 = (fdb_kvs_handle *)0x112eb0;
    fVar6 = fdb_iterator_close(pfStack_2498);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011303e;
    pfStack_24e0 = (fdb_kvs_handle *)0x112ec2;
    fVar6 = fdb_kvs_close(pfStack_24b8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113043;
    pfStack_24e0 = (fdb_kvs_handle *)0x112ed4;
    fVar6 = fdb_kvs_close(pfStack_24a0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113048;
    pfStack_24e0 = (fdb_kvs_handle *)0x112ee6;
    fVar6 = fdb_close(pfStack_2490);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011304d;
    pfStack_24e0 = (fdb_kvs_handle *)0x112ef3;
    fVar6 = fdb_shutdown();
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_24e0 = (fdb_kvs_handle *)0x112f03;
      free(pfVar14);
      pfStack_24e0 = (fdb_kvs_handle *)0x112f08;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_24e0 = (fdb_kvs_handle *)0x112f39;
      fprintf(_stderr,pcVar18,"in-memory snapshot on dirty HB+trie nodes test");
      return;
    }
  }
  else {
LAB_00112fd5:
    pfStack_24e0 = (fdb_kvs_handle *)0x112fda;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pcVar31 = (char *)pfVar9;
LAB_00112fda:
    pfStack_24e0 = (fdb_kvs_handle *)0x112fdf;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fdf:
    pfStack_24e0 = (fdb_kvs_handle *)0x112fe4;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe4:
    pfStack_24e0 = (fdb_kvs_handle *)0x112fe9;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe9:
    pfStack_24e0 = (fdb_kvs_handle *)0x112fee;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pfVar9 = (fdb_kvs_handle *)pcVar31;
LAB_00112fee:
    pcVar31 = (char *)pfVar9;
    pfStack_24e0 = (fdb_kvs_handle *)0x112ff3;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff3:
    pfStack_24e0 = (fdb_kvs_handle *)0x112ff8;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff8:
    pfStack_24e0 = (fdb_kvs_handle *)0x112ffd;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ffd:
    pfStack_24e0 = (fdb_kvs_handle *)0x113002;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113002:
    pfStack_24e0 = (fdb_kvs_handle *)0x113007;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pfVar9 = (fdb_kvs_handle *)pcVar31;
LAB_00113007:
    pfStack_24e0 = (fdb_kvs_handle *)0x11300c;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011300c:
    pfStack_24e0 = (fdb_kvs_handle *)0x113011;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113011:
    pfStack_24e0 = (fdb_kvs_handle *)0x113016;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113016:
    pfStack_24e0 = (fdb_kvs_handle *)0x11301b;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011301b:
    pfStack_24e0 = (fdb_kvs_handle *)0x113020;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113020:
    pfStack_24e0 = (fdb_kvs_handle *)0x113025;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113025:
    pfStack_24e0 = (fdb_kvs_handle *)0x11302a;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302a:
    pfStack_24e0 = (fdb_kvs_handle *)0x11302f;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302f:
    pfStack_24e0 = (fdb_kvs_handle *)0x113034;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113034:
    pfStack_24e0 = (fdb_kvs_handle *)0x113039;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113039:
    pfStack_24e0 = (fdb_kvs_handle *)0x11303e;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011303e:
    pfStack_24e0 = (fdb_kvs_handle *)0x113043;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113043:
    pfStack_24e0 = (fdb_kvs_handle *)0x113048;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113048:
    pfStack_24e0 = (fdb_kvs_handle *)0x11304d;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011304d:
    pfStack_24e0 = (fdb_kvs_handle *)0x113052;
    in_memory_snapshot_on_dirty_hbtrie_test();
  }
  pfStack_24e0 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_28f8 = (fdb_kvs_handle *)0x113077;
  pfStack_2508 = pfVar14;
  pfStack_2500 = (fdb_kvs_handle *)pcVar19;
  pfStack_24f8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_24f0 = pfVar9;
  pfStack_24e8 = (fdb_kvs_handle *)handle_00;
  pfStack_24e0 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_2820,(__timezone_ptr_t)0x0);
  auStack_28e8._4_2_ = 100;
  auStack_28e8._0_4_ = 0x3530256b;
  auStack_28c0._8_2_ = 100;
  auStack_28c0._0_8_ = (fdb_log_callback)0x38302565756c6176;
  builtin_strncpy(acStack_2608,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_2610 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_28f8 = (fdb_kvs_handle *)0x1130c4;
  system((char *)&pfStack_2610);
  pfStack_28f8 = (fdb_kvs_handle *)0x1130c9;
  memleak_start();
  pfStack_28f8 = (fdb_kvs_handle *)0x1130d3;
  pfVar14 = (fdb_kvs_handle *)malloc(0x20);
  pfVar9 = (fdb_kvs_handle *)((long)apbStack_2810 + 0x108);
  pfStack_28f8 = (fdb_kvs_handle *)0x1130e6;
  fdb_get_default_config();
  uStack_26e8 = 0x201;
  auStack_2708[0x18] = '\x01';
  auStack_2708._16_8_ = (fdb_txn *)0x2;
  uStack_26c8 = 1;
  auStack_2708._8_8_ = (fdb_log_callback)0x0;
  pcStack_26b0 = cb_inmem_snap;
  uStack_26a8 = 2;
  pfStack_26a0 = (fdb_txn *)auStack_2890;
  pfStack_28f8 = (fdb_kvs_handle *)0x113130;
  fdb_get_default_kvs_config();
  pfStack_28f8 = (fdb_kvs_handle *)0x113144;
  fVar6 = fdb_open(&pfStack_28e0,"./mvcc_test",(fdb_config *)pfVar9);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcVar18 = auStack_2890 + 0x28;
    pfStack_28f8 = (fdb_kvs_handle *)0x11316a;
    fVar6 = fdb_kvs_open(pfStack_28e0,(fdb_kvs_handle **)(auStack_28c0 + 0x10),"db",
                         (fdb_kvs_config *)pcVar18);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113549;
    pcVar18 = auStack_2890 + 0x28;
    pfStack_28f8 = (fdb_kvs_handle *)0x113190;
    fVar6 = fdb_kvs_open(pfStack_28e0,(fdb_kvs_handle **)(auStack_28c0 + 0x18),"db",
                         (fdb_kvs_config *)pcVar18);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011354e;
    auStack_2890._0_8_ = auStack_28c0._24_8_;
    auStack_2890._8_8_ = (btree *)0xa;
    auStack_2890._24_8_ = auStack_28e8;
    handle_00 = auStack_28c0;
    auStack_2890._16_4_ = 0x20;
    pfVar9 = (fdb_kvs_handle *)((long)&pfVar14->kvs + 2);
    pcVar19 = (char *)apbStack_2810;
    handle._M_i = 0;
    auStack_2890._32_8_ = handle_00;
    do {
      pfStack_28f8 = (fdb_kvs_handle *)0x1131ec;
      sprintf(pcVar19,auStack_28e8,handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar14->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
      *(undefined2 *)((long)&pfVar14->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar9->kvs_config = 0x646e653c;
      pfStack_28f8 = (fdb_kvs_handle *)0x113217;
      sprintf((char *)pfVar14,handle_00,handle._M_i);
      unaff_R13 = (char *)auStack_28c0._16_8_;
      pfStack_28f8 = (fdb_kvs_handle *)0x113224;
      sVar10 = strlen(pcVar19);
      pfStack_28f8 = (fdb_kvs_handle *)0x11323c;
      pcVar18 = (char *)pfVar14;
      fVar6 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar19,sVar10 + 1,pfVar14,0x20);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        pfStack_28f8 = (fdb_kvs_handle *)0x11350e;
        in_memory_snapshot_compaction_test();
        goto LAB_0011350e;
      }
      uVar22 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar22;
    } while (uVar22 != 10);
    pfStack_28f8 = (fdb_kvs_handle *)0x11325a;
    fVar6 = fdb_commit(pfStack_28e0,'\x01');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113553;
    pfStack_28f8 = (fdb_kvs_handle *)0x113273;
    fVar6 = fdb_compact(pfStack_28e0,"./mvcc_test2");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113558;
    pfStack_28f8 = (fdb_kvs_handle *)0x113291;
    fVar6 = fdb_snapshot_open((fdb_kvs_handle *)auStack_28c0._16_8_,&pfStack_28d0,0xffffffffffffffff
                             );
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011355d;
    pfStack_28f8 = (fdb_kvs_handle *)0x1132ab;
    fVar6 = fdb_get_kvs_info(pfStack_28d0,(fdb_kvs_info *)&phStack_2850);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113562;
    if (pkStack_2848 != (kvs_ops_stat *)0xb) {
      pfStack_28f8 = (fdb_kvs_handle *)0x1132cb;
      in_memory_snapshot_compaction_test();
    }
    pcVar18 = (char *)0x0;
    pfStack_28f8 = (fdb_kvs_handle *)0x1132eb;
    fVar6 = fdb_iterator_init(pfStack_28d0,&pfStack_28c8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar16 = (fdb_kvs_handle *)unaff_R13;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113567;
    handle_00 = (char *)apbStack_2810;
    handle._M_i = 0;
    do {
      pfStack_28d8 = (fdb_kvs_handle *)0x0;
      pfStack_28f8 = (fdb_kvs_handle *)0x113315;
      fVar6 = fdb_iterator_get(pfStack_28c8,(fdb_doc **)&pfStack_28d8);
      unaff_R13 = (char *)pfStack_28d8;
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      if ((uint)handle._M_i < 10) {
        pfStack_28f8 = (fdb_kvs_handle *)0x113333;
        sprintf(handle_00,auStack_28e8,handle._M_i);
        *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)&(pfVar14->kvs_config).custom_cmp_param = 0x78787878;
        *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 4) = 0x78787878;
        *(undefined4 *)&pfVar14->kvs = 0x78787878;
        *(uint32_t *)((long)&pfVar14->kvs + 4) = 0x78787878;
        *(undefined2 *)((long)&pfVar14->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar9->kvs_config = 0x646e653c;
        pfStack_28f8 = (fdb_kvs_handle *)0x113360;
        sprintf((char *)pfVar14,auStack_28c0,handle._M_i);
        unaff_R13 = (char *)pfStack_28d8;
        pcVar19 = (char *)pfStack_28d8->op_stats;
        pfStack_28f8 = (fdb_kvs_handle *)0x113378;
        iVar7 = bcmp(pcVar19,handle_00,(size_t)*(fdb_kvs_handle **)&pfStack_28d8->kvs_config);
        if (iVar7 != 0) goto LAB_00113529;
        pcVar19 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_28f8 = (fdb_kvs_handle *)0x113393;
        iVar7 = bcmp(pcVar19,pfVar14,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar7 != 0) goto LAB_00113539;
      }
      else {
        apbStack_2810[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(fdb_kvs_handle **)&pfVar14->kvs_config = (fdb_kvs_handle *)0x756c61765f77656e;
        *(undefined2 *)&(pfVar14->kvs_config).custom_cmp = 0x65;
        pcVar19 = (char *)pfStack_28d8->op_stats;
        pfStack_28f8 = (fdb_kvs_handle *)0x1133d9;
        iVar7 = bcmp(pcVar19,handle_00,(size_t)*(fdb_kvs_handle **)&pfStack_28d8->kvs_config);
        if (iVar7 != 0) goto LAB_0011350e;
        pcVar19 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_28f8 = (fdb_kvs_handle *)0x1133f4;
        iVar7 = bcmp(pcVar19,pfVar14,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar7 != 0) goto LAB_0011351e;
      }
      handle._M_i = (__int_type)((uint)handle._M_i + 1);
      pfStack_28f8 = (fdb_kvs_handle *)0x113408;
      fdb_doc_free((fdb_doc *)pfStack_28d8);
      pfStack_28f8 = (fdb_kvs_handle *)0x113412;
      fVar6 = fdb_iterator_next(pfStack_28c8);
      pfVar16 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar6 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 0xb) goto LAB_0011356c;
    pfStack_28f8 = (fdb_kvs_handle *)0x11342d;
    fVar6 = fdb_iterator_close(pfStack_28c8);
    _Var15._M_i = (__int_type)pfStack_28d0;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113571;
    handle_00 = (char *)apbStack_2810;
    pfStack_28f8 = (fdb_kvs_handle *)0x11344a;
    sVar10 = strlen(handle_00);
    pcVar18 = auStack_28c0 + 0x28;
    pfStack_28f8 = (fdb_kvs_handle *)0x113463;
    fVar6 = fdb_get_kv((fdb_kvs_handle *)_Var15._M_i,handle_00,sVar10 + 1,(void **)pcVar18,
                       (size_t *)(auStack_28c0 + 0x20));
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113576;
    pfStack_28f8 = (fdb_kvs_handle *)0x113480;
    _Var24._M_i = (__int_type)pfVar14;
    iVar7 = bcmp((void *)auStack_28c0._40_8_,pfVar14,auStack_28c0._32_8_);
    _Var15._M_i = auStack_28c0._40_8_;
    if (iVar7 != 0) goto LAB_0011357b;
    pfStack_28f8 = (fdb_kvs_handle *)0x113490;
    fdb_free_block((void *)auStack_28c0._40_8_);
    pfStack_28f8 = (fdb_kvs_handle *)0x11349a;
    fdb_kvs_close(pfStack_28d0);
    pfStack_28f8 = (fdb_kvs_handle *)0x1134a4;
    fVar6 = fdb_close(pfStack_28e0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113586;
    pfStack_28f8 = (fdb_kvs_handle *)0x1134b1;
    fVar6 = fdb_shutdown();
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_28f8 = (fdb_kvs_handle *)0x1134c1;
      free(pfVar14);
      pfStack_28f8 = (fdb_kvs_handle *)0x1134c6;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_28f8 = (fdb_kvs_handle *)0x1134f7;
      fprintf(_stderr,pcVar18,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_00113544:
    pfStack_28f8 = (fdb_kvs_handle *)0x113549;
    in_memory_snapshot_compaction_test();
LAB_00113549:
    pfStack_28f8 = (fdb_kvs_handle *)0x11354e;
    in_memory_snapshot_compaction_test();
LAB_0011354e:
    pfStack_28f8 = (fdb_kvs_handle *)0x113553;
    in_memory_snapshot_compaction_test();
LAB_00113553:
    pfStack_28f8 = (fdb_kvs_handle *)0x113558;
    in_memory_snapshot_compaction_test();
LAB_00113558:
    pfStack_28f8 = (fdb_kvs_handle *)0x11355d;
    in_memory_snapshot_compaction_test();
LAB_0011355d:
    pfStack_28f8 = (fdb_kvs_handle *)0x113562;
    in_memory_snapshot_compaction_test();
LAB_00113562:
    pfStack_28f8 = (fdb_kvs_handle *)0x113567;
    in_memory_snapshot_compaction_test();
    pfVar16 = (fdb_kvs_handle *)unaff_R13;
LAB_00113567:
    pfStack_28f8 = (fdb_kvs_handle *)0x11356c;
    in_memory_snapshot_compaction_test();
LAB_0011356c:
    pfStack_28f8 = (fdb_kvs_handle *)0x113571;
    in_memory_snapshot_compaction_test();
LAB_00113571:
    _Var15._M_i = (__int_type)pfVar9;
    pfStack_28f8 = (fdb_kvs_handle *)0x113576;
    in_memory_snapshot_compaction_test();
LAB_00113576:
    pfStack_28f8 = (fdb_kvs_handle *)0x11357b;
    in_memory_snapshot_compaction_test();
LAB_0011357b:
    pfStack_28f8 = (fdb_kvs_handle *)0x113586;
    _Var24._M_i = _Var15._M_i;
    in_memory_snapshot_compaction_test();
LAB_00113586:
    pfStack_28f8 = (fdb_kvs_handle *)0x11358b;
    in_memory_snapshot_compaction_test();
  }
  pfStack_28f8 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar20 = _Var24._M_i & 0xffffffff;
  pfVar9 = (fdb_kvs_handle *)0x0;
  pcStack_2bb0 = (code *)0x1135b8;
  pfStack_2920 = pfVar14;
  pfStack_2918 = (fdb_kvs_handle *)pcVar19;
  pfStack_2910 = pfVar16;
  pfStack_2908 = (fdb_kvs_handle *)_Var15._M_i;
  pfStack_2900 = (fdb_kvs_handle *)handle_00;
  pfStack_28f8 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)auStack_2b38,(__timezone_ptr_t)0x0);
  if ((int)_Var24._M_i != 2) {
    return;
  }
  pfVar14 = extraout_RDX;
  if (extraout_RDX == (fdb_kvs_handle *)0x0) {
LAB_00113ad8:
    pcStack_2bb0 = (code *)0x113add;
    cb_inmem_snap();
LAB_00113add:
    pcStack_2bb0 = (code *)0x113ae2;
    cb_inmem_snap();
LAB_00113ae2:
    pcStack_2bb0 = (code *)0x113ae7;
    cb_inmem_snap();
LAB_00113ae7:
    pcStack_2bb0 = (code *)0x113aec;
    cb_inmem_snap();
LAB_00113aec:
    pcStack_2bb0 = (code *)0x113af1;
    cb_inmem_snap();
LAB_00113af1:
    pcStack_2bb0 = (code *)0x113af6;
    cb_inmem_snap();
LAB_00113af6:
    pcStack_2bb0 = (code *)0x113afb;
    cb_inmem_snap();
    pfVar17 = pfVar14;
LAB_00113afb:
    pcStack_2bb0 = (code *)0x113b00;
    cb_inmem_snap();
LAB_00113b00:
    pfVar14 = (fdb_kvs_handle *)pcVar18;
    pcStack_2bb0 = (code *)0x113b05;
    cb_inmem_snap();
LAB_00113b05:
    pcStack_2bb0 = (code *)0x113b0a;
    cb_inmem_snap();
  }
  else {
    pfVar14 = (fdb_kvs_handle *)
              CONCAT26(auStack_28e8._6_2_,CONCAT24(auStack_28e8._4_2_,auStack_28e8._0_4_));
    pfVar9 = (fdb_kvs_handle *)(ulong)*(byte *)&((fdb_kvs_handle *)pcVar18)->file;
    iVar7 = *(int *)((long)&(pfVar14->kvs_config).custom_cmp + 4);
    *(int *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = iVar7 + 1;
    if (iVar7 != 4) {
      if (iVar7 != 1) {
        return;
      }
      pcStack_2bb0 = (code *)0x113607;
      fVar6 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar14->kvs_config,&pfStack_2b90,
                                0xffffffffffffffff);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113add;
      pcStack_2bb0 = (code *)0x11361e;
      fVar6 = fdb_get_kvs_info(pfStack_2b90,&fStack_2b68);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113ae7;
      pcVar18 = (char *)&(pfVar14->kvs_config).custom_cmp;
      if (fStack_2b68.last_seqnum != (long)*(int *)&(pfVar14->kvs_config).custom_cmp) {
        pcStack_2bb0 = (code *)0x113a46;
        cb_inmem_snap();
      }
      pcStack_2bb0 = (code *)0x113663;
      pfStack_2b88 = pfVar9;
      pp_Stack_2b80 = (fdb_custom_cmp_variable *)pcVar18;
      fVar6 = fdb_iterator_init(pfStack_2b90,&pfStack_2b98,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar6 == FDB_RESULT_SUCCESS) {
        pfVar14 = (fdb_kvs_handle *)(auStack_2b38 + 10);
        pcVar19 = auStack_2b2e + 6;
        uVar20 = 0;
        do {
          pfStack_2ba0 = (fdb_kvs_handle *)0x0;
          pcStack_2bb0 = (code *)0x11369a;
          fVar6 = fdb_iterator_get(pfStack_2b98,(fdb_doc **)&pfStack_2ba0);
          if (fVar6 != FDB_RESULT_SUCCESS) break;
          lVar21 = CONCAT26(auStack_28e8._6_2_,CONCAT24(auStack_28e8._4_2_,auStack_28e8._0_4_));
          pcStack_2bb0 = (code *)0x1136ba;
          sprintf((char *)afStack_2a28,*(char **)(lVar21 + 0x18),uVar20);
          sVar10 = (size_t)*(int *)(lVar21 + 0x10);
          pcStack_2bb0 = (code *)0x1136ce;
          memset(pcVar19,0x78,sVar10);
          *(undefined4 *)(&(pfVar14->kvs_config).create_if_missing + sVar10) = 0x646e653c;
          *(undefined2 *)(auStack_2b2e + sVar10 + 4) = 0x3e;
          pcStack_2bb0 = (code *)0x1136ee;
          sprintf(pcVar19,*(char **)(lVar21 + 0x20),uVar20);
          pfVar16 = pfStack_2ba0;
          pcVar18 = (char *)pfStack_2ba0->op_stats;
          pcStack_2bb0 = (code *)0x113706;
          iVar7 = bcmp(pcVar18,afStack_2a28,*(size_t *)&pfStack_2ba0->kvs_config);
          if (iVar7 != 0) {
            pcStack_2bb0 = (code *)0x113a88;
            cb_inmem_snap();
LAB_00113a88:
            pcStack_2bb0 = (code *)0x113a98;
            cb_inmem_snap();
            goto LAB_00113a98;
          }
          pcVar18 = (char *)(pfVar16->field_6).seqtree;
          pcStack_2bb0 = (code *)0x113721;
          iVar7 = bcmp(pcVar18,pcVar19,(size_t)(pfVar16->kvs_config).custom_cmp_param);
          if (iVar7 != 0) goto LAB_00113a88;
          uVar20 = (ulong)((int)uVar20 + 1);
          pcStack_2bb0 = (code *)0x113733;
          fdb_doc_free((fdb_doc *)pfVar16);
          pcStack_2bb0 = (code *)0x11373d;
          fVar6 = fdb_iterator_next(pfStack_2b98);
        } while (fVar6 == FDB_RESULT_SUCCESS);
        if ((int)uVar20 != *(int *)pp_Stack_2b80) {
          pcStack_2bb0 = (code *)0x113a64;
          cb_inmem_snap();
        }
        pcStack_2bb0 = (code *)0x11375c;
        fVar6 = fdb_iterator_close(pfStack_2b98);
        pfVar9 = pfStack_2b88;
        if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00113a19;
        pcStack_2bb0 = (code *)0x11376e;
        cb_inmem_snap();
        goto LAB_0011376e;
      }
      goto LAB_00113af1;
    }
LAB_0011376e:
    pfStack_2b88 = pfVar9;
    pcVar18 = (char *)afStack_2a28;
    afStack_2a28[0].algorithm = 0x5f77656e;
    builtin_memcpy(&afStack_2a28[0].algorithm,"key",4);
    pfVar16 = (fdb_kvs_handle *)(auStack_2b2e + 6);
    auStack_2b2e._6_8_ = 0x756c61765f77656e;
    uStack_2b20 = 0x65;
    pfVar9 = *(fdb_kvs_handle **)&pfVar14->kvs_config;
    pcStack_2bb0 = (code *)0x1137b0;
    sVar10 = strlen(pcVar18);
    pcVar19 = (char *)(sVar10 + 1);
    pcStack_2bb0 = (code *)0x1137bc;
    sVar10 = strlen((char *)pfVar16);
    pcStack_2bb0 = (code *)0x1137d1;
    fVar6 = fdb_set_kv(pfVar9,pcVar18,(size_t)pcVar19,pfVar16,sVar10 + 1);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113ae2;
    pcStack_2bb0 = (code *)0x1137ed;
    fVar6 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar14->kvs_config,&pfStack_2b90,
                              0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113aec;
    pcStack_2bb0 = (code *)0x113804;
    fVar6 = fdb_get_kvs_info(pfStack_2b90,&fStack_2b68);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113af6;
    pcVar18 = (char *)&(pfVar14->kvs_config).custom_cmp;
    if (fStack_2b68.last_seqnum != (long)*(int *)&(pfVar14->kvs_config).custom_cmp + 1U) {
      pcStack_2bb0 = (code *)0x113a58;
      cb_inmem_snap();
    }
    pcStack_2bb0 = (code *)0x113842;
    fVar6 = fdb_iterator_init(pfStack_2b90,&pfStack_2b98,(void *)0x0,0,(void *)0x0,0,0);
    pfVar17 = pfVar14;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113afb;
    pcVar19 = auStack_2b2e + 6;
    uVar20 = 0;
    do {
      pfStack_2ba0 = (fdb_kvs_handle *)0x0;
      pcStack_2bb0 = (code *)0x113874;
      fVar6 = fdb_iterator_get(pfStack_2b98,(fdb_doc **)&pfStack_2ba0);
      pfVar14 = pfStack_2ba0;
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar20 < *(int *)pcVar18) {
        lVar21 = CONCAT26(auStack_28e8._6_2_,CONCAT24(auStack_28e8._4_2_,auStack_28e8._0_4_));
        pcStack_2bb0 = (code *)0x11389c;
        sprintf((char *)afStack_2a28,*(char **)(lVar21 + 0x18),uVar20);
        sVar10 = (size_t)*(int *)(lVar21 + 0x10);
        pcStack_2bb0 = (code *)0x1138b0;
        memset(pcVar19,0x78,sVar10);
        *(undefined4 *)(auStack_2b38 + sVar10 + 10) = 0x646e653c;
        *(undefined2 *)(auStack_2b2e + sVar10 + 4) = 0x3e;
        pcStack_2bb0 = (code *)0x1138d5;
        sprintf(pcVar19,*(char **)(lVar21 + 0x20),uVar20);
        pfVar14 = pfStack_2ba0;
        pfVar16 = (fdb_kvs_handle *)pfStack_2ba0->op_stats;
        pcStack_2bb0 = (code *)0x1138ec;
        iVar7 = bcmp(pfVar16,afStack_2a28,*(size_t *)&pfStack_2ba0->kvs_config);
        if (iVar7 != 0) goto LAB_00113aa8;
        pfVar16 = (fdb_kvs_handle *)(pfVar14->field_6).seqtree;
        pcStack_2bb0 = (code *)0x113907;
        iVar7 = bcmp(pfVar16,pcVar19,(size_t)(pfVar14->kvs_config).custom_cmp_param);
        if (iVar7 != 0) goto LAB_00113ab8;
      }
      else {
        afStack_2a28[0].algorithm = 0x5f77656e;
        builtin_memcpy(&afStack_2a28[0].algorithm,"key",4);
        auStack_2b2e._6_8_ = 0x756c61765f77656e;
        uStack_2b20 = 0x65;
        pfVar16 = (fdb_kvs_handle *)pfStack_2ba0->op_stats;
        pcStack_2bb0 = (code *)0x113955;
        iVar7 = bcmp(pfVar16,afStack_2a28,*(size_t *)&pfStack_2ba0->kvs_config);
        if (iVar7 != 0) goto LAB_00113ac8;
        pfVar16 = (fdb_kvs_handle *)(pfVar14->field_6).seqtree;
        pcStack_2bb0 = (code *)0x113970;
        iVar7 = bcmp(pfVar16,pcVar19,(size_t)(pfVar14->kvs_config).custom_cmp_param);
        if (iVar7 != 0) goto LAB_00113a98;
      }
      uVar20 = (ulong)((int)uVar20 + 1);
      pcStack_2bb0 = (code *)0x113984;
      fdb_doc_free((fdb_doc *)pfStack_2ba0);
      pcStack_2bb0 = (code *)0x11398e;
      fVar6 = fdb_iterator_next(pfStack_2b98);
      pfVar17 = pfVar14;
    } while (fVar6 == FDB_RESULT_SUCCESS);
    if ((int)uVar20 != *(int *)pcVar18 + 1) {
      pcStack_2bb0 = (code *)0x113a73;
      cb_inmem_snap();
    }
    pcStack_2bb0 = (code *)0x1139ac;
    fVar6 = fdb_iterator_close(pfStack_2b98);
    pfVar9 = pfStack_2b88;
    pfVar14 = pfStack_2b90;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113b00;
    pfVar17 = (fdb_kvs_handle *)afStack_2a28;
    pcStack_2bb0 = (code *)0x1139ce;
    sVar10 = strlen((char *)pfVar17);
    pcStack_2bb0 = (code *)0x1139e7;
    fVar6 = fdb_get_kv(pfVar14,pfVar17,sVar10 + 1,&pfStack_2b70,&sStack_2b78);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113b05;
    pcStack_2bb0 = (code *)0x113a09;
    iVar7 = bcmp(pfStack_2b70,auStack_2b2e + 6,sStack_2b78);
    pfVar14 = pfStack_2b70;
    if (iVar7 == 0) {
      pcStack_2bb0 = (code *)0x113a19;
      fdb_free_block(pfStack_2b70);
LAB_00113a19:
      pcStack_2bb0 = (code *)0x113a23;
      fdb_kvs_close(pfStack_2b90);
      return;
    }
  }
  pcStack_2bb0 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_3128 = (fdb_iterator *)0x113b3a;
  fStack_2dd0.bub_ctx.space_used = (uint64_t)pfVar14;
  fStack_2dd0.bub_ctx.handle = (fdb_kvs_handle *)pcVar19;
  pfStack_2bc8 = pfVar16;
  pfStack_2bc0 = pfVar17;
  pfStack_2bb8 = pfVar9;
  pcStack_2bb0 = (code *)uVar20;
  gettimeofday(&tStack_2ff8,(__timezone_ptr_t)0x0);
  pfStack_3128 = (fdb_iterator *)0x113b3f;
  memleak_start();
  pfStack_3128 = (fdb_iterator *)0x113b4e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar14 = (fdb_kvs_handle *)&fStack_2dd0.config.encryption_key;
  pfStack_3128 = (fdb_iterator *)0x113b5e;
  fdb_get_default_config();
  config_00 = (fdb_iterator *)auStack_2fe8;
  pfStack_3128 = (fdb_iterator *)0x113b6e;
  fdb_get_default_kvs_config();
  fStack_2dd0.config.encryption_key.bytes[4] = '\0';
  fStack_2dd0.config.encryption_key.bytes[5] = '\0';
  fStack_2dd0.config.encryption_key.bytes[6] = '\0';
  fStack_2dd0.config.encryption_key.bytes[7] = '\0';
  fStack_2dd0.config.encryption_key.bytes[8] = '\0';
  fStack_2dd0.config.encryption_key.bytes[9] = '\0';
  fStack_2dd0.config.encryption_key.bytes[10] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0xb] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0xc] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0xd] = '\x04';
  fStack_2dd0.config.encryption_key.bytes[0xe] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0xf] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x10] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x11] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x12] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x13] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_2dd0.config._180_4_ = 1;
  fStack_2dd0.config.block_reusing_threshold._7_1_ = 0;
  pfStack_3128 = (fdb_iterator *)0x113b98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar9 = (fdb_kvs_handle *)(auStack_3108 + 0x10);
  pfStack_3128 = (fdb_iterator *)0x113baf;
  fVar6 = fdb_open((fdb_file_handle **)pfVar9,"./mvcc_test1",(fdb_config *)pfVar14);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar6;
  pfStack_3128 = (fdb_iterator *)0x113bc1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3108._16_8_,&pfStack_3118,(fdb_kvs_config *)config_00);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfStack_3128 = (fdb_iterator *)0x113bda;
    fVar6 = fdb_snapshot_open(pfStack_3118,(fdb_kvs_handle **)(auStack_3108 + 8),0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114595;
    pfStack_3128 = (fdb_iterator *)0x113bf4;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_3108._8_8_,(fdb_kvs_info *)(apfStack_3058 + 6));
    if ((fdb_kvs_handle *)fStack_3028.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_3128 = (fdb_iterator *)0x113c07;
      snapshot_clone_test();
    }
    pfVar9 = (fdb_kvs_handle *)auStack_3108;
    pfStack_3128 = (fdb_iterator *)0x113c2a;
    fdb_iterator_init((fdb_kvs_handle *)auStack_3108._8_8_,(fdb_iterator **)pfVar9,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_3128 = (fdb_iterator *)0x113c32;
    fVar6 = fdb_iterator_next((fdb_iterator *)auStack_3108._0_8_);
    pfVar17 = (fdb_kvs_handle *)pcVar19;
    if (fVar6 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011459a;
    pfStack_3128 = (fdb_iterator *)0x113c45;
    fdb_iterator_close((fdb_iterator *)auStack_3108._0_8_);
    pfStack_3128 = (fdb_iterator *)0x113c4f;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3108._8_8_);
    lVar21 = 0;
    uVar20 = 0;
    do {
      pfStack_3128 = (fdb_iterator *)0x113c71;
      sprintf(auStack_2fe8 + 0x18,"key%d",uVar20 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113c8d;
      sprintf((char *)&fStack_2ed0,"meta%d",uVar20 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113ca9;
      sprintf((char *)&fStack_2dd0,"body%d",uVar20 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113cb9;
      sVar10 = strlen(auStack_2fe8 + 0x18);
      pfStack_3128 = (fdb_iterator *)0x113cc4;
      sVar11 = strlen((char *)&fStack_2ed0);
      pfStack_3128 = (fdb_iterator *)0x113ccf;
      sVar12 = strlen((char *)&fStack_2dd0);
      pfStack_3128 = (fdb_iterator *)0x113cf4;
      fdb_doc_create((fdb_doc **)(auStack_30d0 + lVar21),auStack_2fe8 + 0x18,sVar10,&fStack_2ed0,
                     sVar11,&fStack_2dd0,sVar12);
      pfStack_3128 = (fdb_iterator *)0x113d03;
      fdb_set(pfStack_3118,*(fdb_doc **)(auStack_30d0 + uVar20 * 8));
      uVar20 = uVar20 + 1;
      lVar21 = lVar21 + 8;
    } while (uVar20 != 5);
    pfStack_3128 = (fdb_iterator *)0x113d23;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\x01');
    uVar20 = 5;
    ppfVar28 = (fdb_doc **)(auStack_30d0 + 0x28);
    do {
      pfStack_3128 = (fdb_iterator *)0x113d4a;
      sprintf(auStack_2fe8 + 0x18,"key%d",uVar20 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113d66;
      sprintf((char *)&fStack_2ed0,"meta%d",uVar20 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113d82;
      sprintf((char *)&fStack_2dd0,"body%d",uVar20 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113d8a;
      sVar10 = strlen(auStack_2fe8 + 0x18);
      pfStack_3128 = (fdb_iterator *)0x113d95;
      sVar11 = strlen((char *)&fStack_2ed0);
      pfStack_3128 = (fdb_iterator *)0x113da0;
      sVar12 = strlen((char *)&fStack_2dd0);
      pfStack_3128 = (fdb_iterator *)0x113dc0;
      fdb_doc_create(ppfVar28,auStack_2fe8 + 0x18,sVar10,&fStack_2ed0,sVar11,&fStack_2dd0,sVar12);
      pfStack_3128 = (fdb_iterator *)0x113dcd;
      fdb_set(pfStack_3118,*ppfVar28);
      uVar20 = uVar20 + 1;
      ppfVar28 = ppfVar28 + 1;
    } while (uVar20 != 9);
    pfVar14 = (fdb_kvs_handle *)(auStack_2fe8 + 0x18);
    pfStack_3128 = (fdb_iterator *)0x113dfc;
    sprintf((char *)pfVar14,"key%d",9);
    config_00 = &fStack_2ed0;
    pfStack_3128 = (fdb_iterator *)0x113e1a;
    sprintf((char *)config_00,"meta%d",9);
    pfVar17 = &fStack_2dd0;
    pfStack_3128 = (fdb_iterator *)0x113e38;
    sprintf((char *)pfVar17,"Body%d",9);
    pfVar9 = (fdb_kvs_handle *)(auStack_30d0 + 0x48);
    pfStack_3128 = (fdb_iterator *)0x113e48;
    pfVar16 = (fdb_kvs_handle *)strlen((char *)pfVar14);
    pfStack_3128 = (fdb_iterator *)0x113e53;
    doc_00 = (fdb_iterator *)strlen((char *)config_00);
    pfStack_3128 = (fdb_iterator *)0x113e5e;
    sVar10 = strlen((char *)pfVar17);
    pfStack_3128 = (fdb_iterator *)0x113e79;
    fdb_doc_create((fdb_doc **)pfVar9,pfVar14,(size_t)pfVar16,config_00,(size_t)doc_00,pfVar17,
                   sVar10);
    pfStack_3128 = (fdb_iterator *)0x113e86;
    fdb_set(pfStack_3118,(fdb_doc *)auStack_30d0._72_8_);
    pfStack_3128 = (fdb_iterator *)0x113e92;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\0');
    **(undefined1 **)(auStack_30d0._72_8_ + 0x40) = 0x62;
    pfStack_3128 = (fdb_iterator *)0x113ea9;
    fdb_set(pfStack_3118,(fdb_doc *)auStack_30d0._72_8_);
    pfStack_3128 = (fdb_iterator *)0x113eb5;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\0');
    pfStack_30e8 = *(fdb_kvs_handle **)(auStack_30d0._72_8_ + 0x28);
    pfStack_3128 = (fdb_iterator *)0x113ed7;
    fVar6 = fdb_snapshot_open(pfStack_3118,&pfStack_30d8,0xffffffffffffffff);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011459f;
    pfStack_3128 = (fdb_iterator *)0x113ef1;
    fdb_set(pfStack_3118,(fdb_doc *)auStack_30d0._72_8_);
    pfStack_3128 = (fdb_iterator *)0x113efd;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\0');
    uVar20 = 10;
    pfVar9 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_3128 = (fdb_iterator *)0x113f24;
      sprintf(auStack_2fe8 + 0x18,"key%d",uVar20 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113f40;
      sprintf((char *)&fStack_2ed0,"meta%d",uVar20 & 0xffffffff);
      pfVar17 = &fStack_2dd0;
      pfStack_3128 = (fdb_iterator *)0x113f5c;
      sprintf((char *)pfVar17,"body%d",uVar20 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_30d0 + (long)pfVar9);
      pfStack_3128 = (fdb_iterator *)0x113f6c;
      pfVar14 = (fdb_kvs_handle *)strlen(auStack_2fe8 + 0x18);
      pfStack_3128 = (fdb_iterator *)0x113f77;
      pfVar16 = (fdb_kvs_handle *)strlen((char *)&fStack_2ed0);
      pfStack_3128 = (fdb_iterator *)0x113f82;
      sVar10 = strlen((char *)pfVar17);
      pfStack_3128 = (fdb_iterator *)0x113fa7;
      fdb_doc_create((fdb_doc **)doc_00,auStack_2fe8 + 0x18,(size_t)pfVar14,&fStack_2ed0,
                     (size_t)pfVar16,pfVar17,sVar10);
      pfStack_3128 = (fdb_iterator *)0x113fb6;
      fdb_set(pfStack_3118,*(fdb_doc **)(auStack_30d0 + uVar20 * 8));
      uVar20 = uVar20 + 1;
      pfVar9 = (fdb_kvs_handle *)((long)pfVar9 + 8);
    } while (uVar20 != 0xf);
    pfStack_3128 = (fdb_iterator *)0x113fd6;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\x01');
    pfStack_3128 = (fdb_iterator *)0x113fee;
    fVar6 = fdb_set_log_callback(pfStack_3118,logCallbackFunc,"snapshot_clone_test");
    config_00 = (fdb_iterator *)0xf;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001145a4;
    pfStack_3128 = (fdb_iterator *)0x11400a;
    fVar6 = fdb_snapshot_open(pfStack_3118,(fdb_kvs_handle **)(auStack_3108 + 8),999999);
    pfVar14 = pfStack_30e8;
    if (fVar6 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001145a9;
    pfStack_3128 = (fdb_iterator *)0x11402a;
    fVar6 = fdb_snapshot_open(pfStack_3118,(fdb_kvs_handle **)(auStack_3108 + 8),
                              (fdb_seqnum_t)pfStack_30e8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001145ae;
    pfStack_3128 = (fdb_iterator *)0x114044;
    fVar6 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3108._8_8_,&pfStack_30f0,
                              (fdb_seqnum_t)pfVar14);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001145b3;
    pfStack_3128 = (fdb_iterator *)0x114056;
    fVar6 = fdb_kvs_close((fdb_kvs_handle *)auStack_3108._8_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001145b8;
    pfStack_3128 = (fdb_iterator *)0x114073;
    fdb_get_kvs_info(pfStack_30f0,(fdb_kvs_info *)(apfStack_3058 + 6));
    if ((fdb_kvs_handle *)fStack_3028.last_seqnum != pfVar14) {
      pfStack_3128 = (fdb_iterator *)0x114089;
      snapshot_clone_test();
    }
    uVar20 = 0xf;
    config_00 = (fdb_iterator *)apfStack_3058;
    do {
      pfStack_3128 = (fdb_iterator *)0x1140b1;
      sprintf(auStack_2fe8 + 0x18,"key%d",uVar20 & 0xffffffff);
      doc_00 = &fStack_2ed0;
      pfStack_3128 = (fdb_iterator *)0x1140cc;
      sprintf((char *)doc_00,"meta%d",uVar20 & 0xffffffff);
      pfVar14 = &fStack_2dd0;
      pfStack_3128 = (fdb_iterator *)0x1140e7;
      sprintf((char *)pfVar14,"body%d",uVar20 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x1140ef;
      pfVar17 = (fdb_kvs_handle *)strlen(auStack_2fe8 + 0x18);
      pfStack_3128 = (fdb_iterator *)0x1140fa;
      pfVar16 = (fdb_kvs_handle *)strlen((char *)doc_00);
      pfStack_3128 = (fdb_iterator *)0x114105;
      sVar10 = strlen((char *)pfVar14);
      pfStack_3128 = (fdb_iterator *)0x114125;
      fdb_doc_create((fdb_doc **)config_00,auStack_2fe8 + 0x18,(size_t)pfVar17,doc_00,
                     (size_t)pfVar16,pfVar14,sVar10);
      pfStack_3128 = (fdb_iterator *)0x114132;
      fdb_set(pfStack_3118,*(fdb_doc **)config_00);
      uVar20 = uVar20 + 1;
      config_00 = (fdb_iterator *)((long)config_00 + 8);
    } while (uVar20 != 0x14);
    pfStack_3128 = (fdb_iterator *)0x11414f;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\0');
    pfStack_3128 = (fdb_iterator *)0x114165;
    fVar6 = fdb_snapshot_open(pfStack_30d8,&pfStack_30e0,0xffffffffffffffff);
    pfVar9 = (fdb_kvs_handle *)0x14;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001145bd;
    pfVar9 = (fdb_kvs_handle *)&pfStack_3110;
    pfStack_3128 = (fdb_iterator *)0x1141b0;
    fdb_doc_create((fdb_doc **)pfVar9,
                   (void *)(*(size_t **)
                             (auStack_30d0 + (((long)pfStack_30e8 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_30d0 + (((long)pfStack_30e8 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_3128 = (fdb_iterator *)0x1141bd;
    fVar6 = fdb_get_metaonly(pfStack_30f0,(fdb_doc *)pfStack_3110);
    if (fVar6 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001145c2;
    pfStack_3128 = (fdb_iterator *)0x1141d3;
    fdb_doc_free((fdb_doc *)pfStack_3110);
    pfStack_3128 = (fdb_iterator *)0x1141f7;
    fdb_doc_create((fdb_doc **)&pfStack_3110,*(kvs_ops_stat **)(auStack_30d0._40_8_ + 0x20),
                   (size_t)*(fdb_kvs_handle **)(fdb_kvs_config *)auStack_30d0._40_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_3128 = (fdb_iterator *)0x114204;
    fVar6 = fdb_get_metaonly(pfStack_30f0,(fdb_doc *)pfStack_3110);
    pcVar19 = (char *)auStack_30d0._40_8_;
    doc_01 = pfStack_3110;
    pfVar9 = (fdb_kvs_handle *)&pfStack_3110;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001145c7;
    pfVar14 = (fdb_kvs_handle *)pfStack_3110->op_stats;
    config_00 = *(fdb_iterator **)(auStack_30d0._40_8_ + 0x20);
    pfStack_3128 = (fdb_iterator *)0x11422e;
    iVar7 = bcmp(pfVar14,config_00,(size_t)*(fdb_kvs_handle **)(fdb_kvs_config *)auStack_30d0._40_8_
                );
    if (iVar7 != 0) goto LAB_001145cc;
    pfVar14 = (fdb_kvs_handle *)doc_01->staletree;
    config_00 = *(fdb_iterator **)((long)pcVar19 + 0x38);
    pfStack_3128 = (fdb_iterator *)0x11424f;
    iVar7 = bcmp(pfVar14,config_00,(size_t)((fdb_kvs_config *)pcVar19)->custom_cmp);
    if (iVar7 != 0) goto LAB_001145d7;
    pfStack_3128 = (fdb_iterator *)0x11425f;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_3128 = (fdb_iterator *)0x114280;
    fdb_doc_create((fdb_doc **)&pfStack_3110,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_3110->fhandle = (fdb_file_handle *)0x6;
    pfStack_3128 = (fdb_iterator *)0x114295;
    fVar6 = fdb_get_byseq(pfStack_30f0,(fdb_doc *)pfStack_3110);
    pfVar9 = pfStack_3110;
    doc_01 = (fdb_kvs_handle *)&pfStack_3110;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001145e2;
    pfVar14 = (fdb_kvs_handle *)pfStack_3110->op_stats;
    config_00 = *(fdb_iterator **)(auStack_30d0._40_8_ + 0x20);
    pfStack_3128 = (fdb_iterator *)0x1142be;
    iVar7 = bcmp(pfVar14,config_00,*(size_t *)&pfStack_3110->kvs_config);
    pcVar19 = (char *)auStack_30d0._40_8_;
    if (iVar7 != 0) goto LAB_001145e7;
    pfVar14 = (fdb_kvs_handle *)(pfVar9->field_6).seqtree;
    config_00 = (fdb_iterator *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_30d0._40_8_ + 0x40))->
                seqtree;
    pfStack_3128 = (fdb_iterator *)0x1142de;
    iVar7 = bcmp(pfVar14,config_00,(size_t)(pfVar9->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_001145f2;
    pfStack_3128 = (fdb_iterator *)0x1142ee;
    fdb_doc_free((fdb_doc *)pfVar9);
    pfVar9 = (fdb_kvs_handle *)&pfStack_3110;
    pfStack_3110 = (fdb_kvs_handle *)0x0;
    pfVar16 = (fdb_kvs_handle *)0x0;
    pfStack_3128 = (fdb_iterator *)0x11431d;
    fdb_iterator_init(pfStack_30f0,(fdb_iterator **)auStack_3108,(void *)0x0,0,(void *)0x0,0,0);
    pfVar17 = pfVar14;
    do {
      pfStack_3128 = (fdb_iterator *)0x11432a;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_3108._0_8_,(fdb_doc **)pfVar9);
      pfVar14 = pfStack_3110;
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_0011454f:
        pfStack_3128 = (fdb_iterator *)0x114554;
        snapshot_clone_test();
        pfVar14 = pfVar17;
LAB_00114554:
        pfStack_3128 = (fdb_iterator *)0x11455f;
        snapshot_clone_test();
LAB_0011455f:
        pfStack_3128 = (fdb_iterator *)0x11456a;
        snapshot_clone_test();
        goto LAB_0011456a;
      }
      config_00 = (fdb_iterator *)pfStack_3110->op_stats;
      doc_00 = *(fdb_iterator **)(auStack_30d0 + (long)pfVar16 * 8);
      pcVar19 = (char *)doc_00->_seqnum;
      pfStack_3128 = (fdb_iterator *)0x114352;
      iVar7 = bcmp(config_00,pcVar19,*(size_t *)&pfStack_3110->kvs_config);
      pfVar17 = pfVar14;
      if (iVar7 != 0) {
        pfStack_3128 = (fdb_iterator *)0x11454f;
        snapshot_clone_test();
        goto LAB_0011454f;
      }
      config_00 = (fdb_iterator *)pfVar14->staletree;
      pcVar19 = (char *)doc_00->tree_cursor_start;
      pfStack_3128 = (fdb_iterator *)0x114371;
      iVar7 = bcmp(config_00,pcVar19,(size_t)(pfVar14->kvs_config).custom_cmp);
      if (iVar7 != 0) goto LAB_0011455f;
      config_00 = (fdb_iterator *)(pfVar14->field_6).seqtree;
      pcVar19 = (char *)doc_00->tree_cursor_prev;
      pfStack_3128 = (fdb_iterator *)0x114390;
      iVar7 = bcmp(config_00,pcVar19,(size_t)(pfVar14->kvs_config).custom_cmp_param);
      if (iVar7 != 0) goto LAB_00114554;
      pfStack_3128 = (fdb_iterator *)0x1143a0;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_3110 = (fdb_kvs_handle *)0x0;
      pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
      pfStack_3128 = (fdb_iterator *)0x1143b6;
      pfVar26 = (fdb_iterator *)auStack_3108._0_8_;
      fVar6 = fdb_iterator_next((fdb_iterator *)auStack_3108._0_8_);
    } while (fVar6 == FDB_RESULT_SUCCESS);
    if ((int)pfVar16 == 10) {
      pfStack_3128 = (fdb_iterator *)0x1143d5;
      fdb_iterator_close((fdb_iterator *)auStack_3108._0_8_);
      pfVar16 = (fdb_kvs_handle *)0x0;
      pfStack_3128 = (fdb_iterator *)0x1143f6;
      fdb_iterator_init(pfStack_30e0,(fdb_iterator **)auStack_3108,(void *)0x0,0,(void *)0x0,0,0);
      pfVar9 = (fdb_kvs_handle *)&pfStack_3110;
      do {
        pfStack_3128 = (fdb_iterator *)0x114408;
        fVar6 = fdb_iterator_get((fdb_iterator *)auStack_3108._0_8_,(fdb_doc **)pfVar9);
        pfVar14 = pfStack_3110;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114575;
        config_00 = (fdb_iterator *)pfStack_3110->op_stats;
        doc_00 = *(fdb_iterator **)(auStack_30d0 + (long)pfVar16 * 8);
        pcVar19 = (char *)doc_00->_seqnum;
        pfStack_3128 = (fdb_iterator *)0x114430;
        iVar7 = bcmp(config_00,pcVar19,*(size_t *)&pfStack_3110->kvs_config);
        if (iVar7 != 0) goto LAB_0011456a;
        config_00 = (fdb_iterator *)pfVar14->staletree;
        pcVar19 = (char *)doc_00->tree_cursor_start;
        pfStack_3128 = (fdb_iterator *)0x11444f;
        iVar7 = bcmp(config_00,pcVar19,(size_t)(pfVar14->kvs_config).custom_cmp);
        if (iVar7 != 0) goto LAB_00114585;
        config_00 = (fdb_iterator *)(pfVar14->field_6).seqtree;
        pcVar19 = (char *)doc_00->tree_cursor_prev;
        pfStack_3128 = (fdb_iterator *)0x11446e;
        iVar7 = bcmp(config_00,pcVar19,(size_t)(pfVar14->kvs_config).custom_cmp_param);
        if (iVar7 != 0) goto LAB_0011457a;
        pfStack_3128 = (fdb_iterator *)0x11447e;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_3110 = (fdb_kvs_handle *)0x0;
        pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
        pfStack_3128 = (fdb_iterator *)0x114494;
        pfVar26 = (fdb_iterator *)auStack_3108._0_8_;
        fVar6 = fdb_iterator_next((fdb_iterator *)auStack_3108._0_8_);
        pfVar17 = pfVar14;
      } while (fVar6 == FDB_RESULT_SUCCESS);
      if ((int)pfVar16 == 10) {
        pfStack_3128 = (fdb_iterator *)0x1144b0;
        fdb_iterator_close((fdb_iterator *)auStack_3108._0_8_);
        pfStack_3128 = (fdb_iterator *)0x1144ba;
        fdb_kvs_close(pfStack_3118);
        pfStack_3128 = (fdb_iterator *)0x1144c4;
        fdb_kvs_close(pfStack_30d8);
        pfStack_3128 = (fdb_iterator *)0x1144ce;
        fdb_kvs_close(pfStack_30e0);
        pfStack_3128 = (fdb_iterator *)0x1144d8;
        fdb_kvs_close(pfStack_30f0);
        pfStack_3128 = (fdb_iterator *)0x1144e2;
        fdb_close((fdb_file_handle *)auStack_3108._16_8_);
        lVar21 = 0;
        do {
          pfStack_3128 = (fdb_iterator *)0x1144ee;
          fdb_doc_free(*(fdb_doc **)(auStack_30d0 + lVar21 * 8));
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x14);
        pfStack_3128 = (fdb_iterator *)0x1144fc;
        fdb_shutdown();
        pfStack_3128 = (fdb_iterator *)0x114501;
        memleak_end();
        pcVar18 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar18 = "%s FAILED\n";
        }
        pfStack_3128 = (fdb_iterator *)0x114532;
        fprintf(_stderr,pcVar18,"snapshot clone test");
        return;
      }
      goto LAB_00114602;
    }
  }
  else {
LAB_00114590:
    pfStack_3128 = (fdb_iterator *)0x114595;
    snapshot_clone_test();
LAB_00114595:
    pfStack_3128 = (fdb_iterator *)0x11459a;
    snapshot_clone_test();
    pfVar17 = (fdb_kvs_handle *)pcVar19;
LAB_0011459a:
    pfStack_3128 = (fdb_iterator *)0x11459f;
    snapshot_clone_test();
LAB_0011459f:
    pfStack_3128 = (fdb_iterator *)0x1145a4;
    snapshot_clone_test();
LAB_001145a4:
    pfStack_3128 = (fdb_iterator *)0x1145a9;
    snapshot_clone_test();
LAB_001145a9:
    pfStack_3128 = (fdb_iterator *)0x1145ae;
    snapshot_clone_test();
LAB_001145ae:
    pfStack_3128 = (fdb_iterator *)0x1145b3;
    snapshot_clone_test();
LAB_001145b3:
    pfStack_3128 = (fdb_iterator *)0x1145b8;
    snapshot_clone_test();
LAB_001145b8:
    pfStack_3128 = (fdb_iterator *)0x1145bd;
    snapshot_clone_test();
LAB_001145bd:
    pfStack_3128 = (fdb_iterator *)0x1145c2;
    snapshot_clone_test();
LAB_001145c2:
    pfStack_3128 = (fdb_iterator *)0x1145c7;
    snapshot_clone_test();
LAB_001145c7:
    pcVar19 = (char *)pfVar17;
    doc_01 = pfVar9;
    pfStack_3128 = (fdb_iterator *)0x1145cc;
    snapshot_clone_test();
LAB_001145cc:
    pfStack_3128 = (fdb_iterator *)0x1145d7;
    snapshot_clone_test();
LAB_001145d7:
    pfStack_3128 = (fdb_iterator *)0x1145e2;
    snapshot_clone_test();
LAB_001145e2:
    pfVar9 = doc_01;
    pfStack_3128 = (fdb_iterator *)0x1145e7;
    snapshot_clone_test();
LAB_001145e7:
    pfStack_3128 = (fdb_iterator *)0x1145f2;
    snapshot_clone_test();
LAB_001145f2:
    pfStack_3128 = (fdb_iterator *)0x1145fd;
    pfVar26 = config_00;
    snapshot_clone_test();
  }
  pfStack_3128 = (fdb_iterator *)0x114602;
  snapshot_clone_test();
LAB_00114602:
  pfStack_3128 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_3180 = (fdb_doc *)0x0;
  lVar21 = (((atomic<unsigned_long> *)&pfVar26->handle)->super___atomic_base<unsigned_long>)._M_i;
  iVar7 = *(int *)&(((atomic<unsigned_long> *)&pfVar26->seqtree_iterator)->
                   super___atomic_base<unsigned_long>)._M_i;
  pfStack_3150 = pfVar9;
  pfStack_3148 = (fdb_kvs_handle *)pcVar19;
  pfStack_3140 = pfVar16;
  pfStack_3138 = pfVar14;
  pfStack_3130 = config_00;
  pfStack_3128 = doc_00;
  gettimeofday(&tStack_3160,(__timezone_ptr_t)0x0);
  fVar6 = fdb_snapshot_open((fdb_kvs_handle *)
                            (((atomic<unsigned_long> *)&pfVar26->hbtrie_iterator)->
                            super___atomic_base<unsigned_long>)._M_i,&pfStack_3168,
                            0xffffffffffffffff);
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar23 = 0;
  iStack_316c = iVar7;
  fdb_iterator_init(pfStack_3168,&pfStack_3178,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar6 = fdb_iterator_get(pfStack_3178,&pfStack_3180);
    pfVar27 = pfStack_3180;
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar2 = pfStack_3180->key;
    lVar3 = *(long *)(lVar21 + lVar23 * 8);
    pvVar4 = *(void **)(lVar3 + 0x20);
    iVar7 = bcmp(pvVar2,pvVar4,pfStack_3180->keylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pvVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar2 = pfVar27->body;
    pvVar4 = *(void **)(lVar3 + 0x40);
    iVar7 = bcmp(pvVar2,pvVar4,pfVar27->bodylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pvVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(pfVar27);
    pfStack_3180 = (fdb_doc *)0x0;
    lVar23 = lVar23 + 1;
    fVar6 = fdb_iterator_next(pfStack_3178);
  } while (fVar6 == FDB_RESULT_SUCCESS);
  if (iStack_316c / 2 == (int)lVar23) {
    fdb_iterator_close(pfStack_3178);
    fdb_kvs_close(pfStack_3168);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void rollback_secondary_kvs()
{
    TEST_INIT();
    memleak_start();

    int r;
    void *value_out;
    size_t valuelen_out;

    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &kv1, &kvs_config);
    fdb_kvs_open_default(dbfile, &kv2, &kvs_config);

    // seq:2
    status = fdb_set_kv(kv1, (void *) "a", 1, (void *)"val-a", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(kv1, (void *) "b", 1, (void *)"val-b", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // seq:3
    status = fdb_set_kv(kv1, (void *) "b", 1, (void *)"val-v", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // seq:4
    status = fdb_del_kv(kv1, (void *)"a", 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // get 'a' via kv2
    status = fdb_get_kv(kv2, (void *)"b", 1, &value_out, &valuelen_out);
    free(value_out);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // rollback seq:3 via kv2
    status = fdb_rollback(&kv2, 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("rollback secondary kv");
}